

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O3

int tcg_gen_code_sparc64(TCGContext_conflict8 *s,TranslationBlock *tb)

{
  anon_union_16_2_aaf24f3d_for_link *paVar1;
  TCGTemp **ppTVar2;
  char **ppcVar3;
  ushort uVar4;
  TCGOp *pTVar5;
  TCGArg TVar6;
  TCGTemp *ts;
  tcg_target_ulong tVar7;
  TCGOpDef *pTVar8;
  ulong *puVar9;
  TCGArgConstraint *pTVar10;
  uintptr_t value;
  TCGRegSet *pTVar11;
  uint *puVar12;
  void *pvVar13;
  anon_union_16_2_aaf24f3d_for_link *paVar14;
  TCGLabel *pTVar15;
  tcg_insn_unit tVar16;
  TCGType TVar17;
  byte bVar18;
  _Bool _Var19;
  TCGLifeData arg_life;
  TCGOpcode TVar20;
  TCGReg TVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  char *pcVar25;
  TCGOp *pTVar26;
  TCGOp *pTVar27;
  TCGTemp *pTVar28;
  TCGCond *pTVar29;
  byte *pbVar30;
  tcg_insn_unit *ptVar31;
  uint8_t *puVar32;
  QTailQLink *pQVar33;
  QTailQLink *extraout_RAX;
  void **ppvVar34;
  QTailQLink *extraout_RAX_00;
  QTailQLink *extraout_RAX_01;
  byte bVar35;
  char cVar41;
  uint uVar36;
  TCGReg arg;
  int src;
  TCGCond base;
  ulong uVar37;
  undefined1 *puVar38;
  TCGLabel *pTVar39;
  QTailQLink *pQVar40;
  int iVar42;
  TCGCond r;
  TCGArg TVar43;
  ulong uVar44;
  uint uVar45;
  uint uVar46;
  TCGOpcode TVar47;
  TCGReg TVar48;
  int opc;
  TCGType TVar49;
  TCGCond TVar50;
  long lVar51;
  ulong uVar52;
  uint uVar53;
  long lVar54;
  TCGContext_conflict8 *s_00;
  uint uVar55;
  ulong in_R9;
  TCGOp *pTVar56;
  uint uVar57;
  TCGRegSet allocated_regs;
  ulong uVar58;
  TCGLabel *pTVar59;
  TCGLabelQemuLdst *pTVar60;
  TCGRegSet TVar61;
  TCGType type;
  TCGType rexw;
  long lVar62;
  tcg_insn_unit **pptVar63;
  byte bVar64;
  int iVar65;
  long lVar66;
  undefined2 uVar67;
  TCGOpcode *pTVar68;
  ulong uVar69;
  TCGRelocation *pTVar70;
  bool bVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  TCGArg new_args [16];
  byte bStackY_1f9;
  QTailQLink *pQStackY_1e0;
  uint uStackY_1cc;
  TCGLabel *in_stack_fffffffffffffe88;
  uint local_134;
  TCGLabel *local_108;
  TCGLabel *local_100;
  TCGLabel *local_f8;
  tcg_insn_unit local_f0;
  undefined4 uStack_ec;
  ulong local_e8;
  TCGCond local_e0;
  undefined4 uStack_dc;
  target_ulong (*local_80) [2];
  int local_78;
  int local_74;
  int local_70;
  int local_68;
  int local_64;
  
  pcVar25 = getenv("UNICORN_DEBUG");
  if (pcVar25 != (char *)0x0) {
    tcg_dump_ops_sparc64(s,false,"TCG before optimization:");
  }
  tcg_optimize_sparc64(s);
  if ((s->ops).tqh_first != (TCGOp *)0x0) {
    bVar18 = 0;
    pTVar56 = (s->ops).tqh_first;
    do {
      pTVar5 = (pTVar56->link).tqe_next;
      uVar45 = *(uint *)pTVar56;
      uVar36 = uVar45 & 0xff;
      bVar35 = bVar18;
      if (uVar36 < 0x81) {
        if (uVar36 == 1) {
          uVar45 = *(uint *)pTVar56->args[0];
          if (0xffff < uVar45) {
            if ((((uVar45 & 0xffff0000) != 0x10000) ||
                (pTVar26 = (TCGOp *)((pTVar56->link).tqe_circ.tql_prev)->tql_prev->tql_next,
                *(char *)pTVar26 != '\x03')) ||
               ((uint *)pTVar56->args[0] != (uint *)pTVar26->args[0])) {
              bVar18 = 0;
              goto LAB_00a1e578;
            }
            tcg_op_remove_sparc64(s,pTVar26);
            bVar18 = 0;
          }
        }
        else {
          if (uVar36 == 2) {
            bVar35 = ((byte)pTVar56->args[(ulong)((uVar45 >> 8 & 0xf) + (uVar45 >> 0xc & 0xf)) + 1]
                     & 8) >> 3 | bVar18;
          }
          else if (uVar36 == 3) goto LAB_00a1e504;
LAB_00a1e564:
          bVar71 = bVar18 == 0;
          bVar18 = bVar35;
          if (bVar71) goto LAB_00a1e578;
        }
        tcg_op_remove_sparc64(s,pTVar56);
      }
      else if (uVar36 != 0x81) {
        if ((uVar36 == 0x82) || (uVar36 == 0x84)) {
LAB_00a1e504:
          bVar35 = 1;
        }
        goto LAB_00a1e564;
      }
LAB_00a1e578:
      pTVar56 = pTVar5;
    } while (pTVar5 != (TCGOp *)0x0);
  }
  liveness_pass_1(s);
  if (0 < s->nb_indirects) {
    uVar45 = s->nb_globals;
    if ((long)(int)uVar45 < 1) {
      uVar45 = 0;
    }
    else {
      lVar51 = 0;
      do {
        if (((&s->temps[0].field_0x4)[lVar51] & 2) == 0) {
          pTVar28 = (TCGTemp *)0x0;
        }
        else {
          iVar23 = s->nb_temps;
          s->nb_temps = iVar23 + 1;
          pTVar28 = s->temps + iVar23;
          ppcVar3 = &s->temps[iVar23].name;
          *ppcVar3 = (char *)0x0;
          ppcVar3[1] = (char *)0x0;
          ppTVar2 = &s->temps[iVar23].mem_base;
          *ppTVar2 = (TCGTemp *)0x0;
          ppTVar2[1] = (TCGTemp *)0x0;
          *(undefined8 *)(s->temps + iVar23) = 0;
          s->temps[iVar23].val = 0;
          s->temps[iVar23].state_ptr = (void *)0x0;
          in_R9 = (ulong)(byte)(&s->temps[0].field_0x3)[lVar51] << 0x18;
          *(ulong *)(s->temps + iVar23) = in_R9;
          *(ulong *)(s->temps + iVar23) =
               (ulong)((uint)(byte)(&s->temps[0].field_0x2)[lVar51] << 0x10 | (uint)in_R9);
        }
        *(TCGTemp **)((long)&s->temps[0].state_ptr + lVar51) = pTVar28;
        *(undefined8 *)((long)&s->temps[0].state + lVar51) = 1;
        lVar51 = lVar51 + 0x38;
      } while ((long)(int)uVar45 * 0x38 - lVar51 != 0);
    }
    if ((int)uVar45 < s->nb_temps) {
      lVar51 = (ulong)(uint)s->nb_temps - (ulong)uVar45;
      ppvVar34 = &s->temps[uVar45].state_ptr;
      do {
        *ppvVar34 = (void *)0x0;
        ppvVar34[-1] = (void *)0x1;
        ppvVar34 = ppvVar34 + 7;
        lVar51 = lVar51 + -1;
      } while (lVar51 != 0);
    }
    if ((s->ops).tqh_first != (TCGOp *)0x0) {
      bVar71 = false;
      pTVar56 = (s->ops).tqh_first;
      do {
        uVar45 = *(uint *)pTVar56;
        if ((uVar45 & 0xff) == 2) {
          uVar44 = (ulong)(uVar45 >> 0xc & 0xf);
          uVar46 = uVar45 >> 8 & 0xf;
        }
        else {
          uVar36 = (uVar45 & 0xff) << 5;
          uVar46 = (uint)(&s->tcg_op_defs->nb_iargs)[uVar36];
          uVar44 = (ulong)(&s->tcg_op_defs->nb_oargs)[uVar36];
        }
        pTVar5 = (pTVar56->link).tqe_next;
        uVar45 = uVar45 >> 0x10;
        if (uVar46 != 0) {
          uVar69 = (ulong)(uVar46 + (int)uVar44);
          uVar58 = uVar44;
          do {
            TVar43 = pTVar56->args[uVar58];
            if (((TVar43 != 0) && (TVar6 = *(TCGArg *)(TVar43 + 0x30), TVar6 != 0)) &&
               (*(long *)(TVar43 + 0x28) == 1)) {
              TVar47 = INDEX_op_ld_i32;
              if (*(char *)(TVar43 + 3) != '\0') {
                TVar47 = INDEX_op_ld_i64;
              }
              pTVar26 = tcg_op_alloc(s,TVar47);
              (pTVar26->link).tqe_circ.tql_prev = (pTVar56->link).tqe_circ.tql_prev;
              (pTVar26->link).tqe_next = pTVar56;
              ((pTVar56->link).tqe_circ.tql_prev)->tql_next = pTVar26;
              (pTVar56->link).tqe_circ.tql_prev = (QTailQLink *)&pTVar26->link;
              pTVar26->args[0] = TVar6;
              pTVar26->args[1] = *(TCGArg *)(TVar43 + 0x10);
              pTVar26->args[2] = *(TCGArg *)(TVar43 + 0x18);
              *(undefined8 *)(TVar43 + 0x28) = 2;
            }
            uVar58 = uVar58 + 1;
            uVar37 = uVar44;
          } while (uVar58 < uVar69);
          do {
            TVar43 = pTVar56->args[uVar37];
            if ((TVar43 != 0) && (*(TCGArg *)(TVar43 + 0x30) != 0)) {
              pTVar56->args[uVar37] = *(TCGArg *)(TVar43 + 0x30);
              bVar71 = true;
              if ((uVar45 >> ((byte)uVar37 & 0x1f) & 4) != 0) {
                *(undefined8 *)(TVar43 + 0x28) = 1;
              }
            }
            uVar37 = uVar37 + 1;
          } while (uVar37 < uVar69);
        }
        in_R9 = uVar44;
        if ((int)uVar44 != 0) {
          paVar1 = &pTVar56->link;
          uVar58 = 0;
          do {
            TVar43 = pTVar56->args[uVar58];
            TVar6 = *(TCGArg *)(TVar43 + 0x30);
            if (TVar6 != 0) {
              pTVar56->args[uVar58] = TVar6;
              *(undefined8 *)(TVar43 + 0x28) = 0;
              if ((uVar45 >> ((uint)uVar58 & 0x1f) & 1) != 0) {
                TVar47 = INDEX_op_st_i32;
                if (*(char *)(TVar43 + 3) != '\0') {
                  TVar47 = INDEX_op_st_i64;
                }
                pTVar27 = tcg_op_alloc(s,TVar47);
                pTVar26 = paVar1->tqe_next;
                (pTVar27->link).tqe_next = pTVar26;
                paVar14 = &pTVar26->link;
                if (pTVar26 == (TCGOp *)0x0) {
                  paVar14 = (anon_union_16_2_aaf24f3d_for_link *)&s->ops;
                }
                (paVar14->tqe_circ).tql_prev = (QTailQLink *)&pTVar27->link;
                paVar1->tqe_next = pTVar27;
                (pTVar27->link).tqe_circ.tql_prev = (QTailQLink *)paVar1;
                pTVar27->args[0] = TVar6;
                pTVar27->args[1] = *(TCGArg *)(TVar43 + 0x10);
                pTVar27->args[2] = *(TCGArg *)(TVar43 + 0x18);
                *(undefined8 *)(TVar43 + 0x28) = 2;
              }
              bVar71 = true;
              if ((uVar45 >> ((byte)uVar58 & 0x1f) & 4) != 0) {
                *(undefined8 *)(TVar43 + 0x28) = 1;
              }
            }
            uVar58 = uVar58 + 1;
          } while (uVar44 != uVar58);
        }
        pTVar56 = pTVar5;
      } while (pTVar5 != (TCGOp *)0x0);
      if (bVar71) {
        liveness_pass_1(s);
      }
    }
  }
  uVar45 = s->nb_globals;
  if ((long)(int)uVar45 < 1) {
    uVar45 = 0;
  }
  else {
    lVar51 = 0;
    do {
      (&s->temps[0].field_0x1)[lVar51] =
           (char)((uint)((*(ulong *)(&s->temps[0].field_0x0 + lVar51) & 0x100000000) == 0) * 0x100 +
                  0x100 >> 8);
      lVar51 = lVar51 + 0x38;
    } while ((long)(int)uVar45 * 0x38 - lVar51 != 0);
  }
  if ((int)uVar45 < s->nb_temps) {
    lVar51 = (ulong)(uint)s->nb_temps - (ulong)uVar45;
    pTVar28 = s->temps + uVar45;
    do {
      *(ulong *)pTVar28 =
           *(ulong *)pTVar28 & 0xffffffeeffff00ff |
           (ulong)((uint)(*(ulong *)pTVar28 >> 0x1d) & 0x200);
      pTVar28 = pTVar28 + 1;
      lVar51 = lVar51 + -1;
    } while (lVar51 != 0);
  }
  ppTVar2 = s->reg_to_temp;
  memset(ppTVar2,0,0x100);
  ptVar31 = (tcg_insn_unit *)(tb->tc).ptr;
  s->code_buf = ptVar31;
  s->code_ptr = ptVar31;
  (s->ldst_labels).sqh_first = (TCGLabelQemuLdst *)0x0;
  (s->ldst_labels).sqh_last = &(s->ldst_labels).sqh_first;
  s->pool_labels = (TCGLabelPoolData *)0x0;
  pcVar25 = getenv("UNICORN_DEBUG");
  if (pcVar25 != (char *)0x0) {
    tcg_dump_ops_sparc64(s,false,"TCG before codegen:");
  }
  pTVar68 = (TCGOpcode *)(s->ops).tqh_circ.tql_next;
  if (pTVar68 == (TCGOpcode *)0x0) {
    ptVar31 = s->code_ptr;
    uVar58 = (long)ptVar31 - (long)s->code_buf;
    local_134 = 0xffffffff;
  }
  else {
    local_80 = s->gen_insn_data;
    local_134 = 0xffffffff;
    do {
      TVar47 = *pTVar68;
      arg_life = (TCGLifeData)(TVar47 >> 0x10);
      uVar44 = in_R9;
      if (INDEX_op_ctpop_i32 < (TVar47 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64))) {
        TVar20 = TVar47 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64);
        if (TVar20 < INDEX_op_mov_vec) {
          if (TVar20 != INDEX_op_mov_i64) {
            if (TVar20 == INDEX_op_movi_i64) goto switchD_00a1ea86_caseD_6;
            if (TVar20 != INDEX_op_insn_start) goto switchD_00a1ea86_caseD_3;
            if (((int)local_134 < 0) ||
               (uVar58 = (long)s->code_ptr - (long)s->code_buf,
               s->gen_insn_end_off[local_134] = (uint16_t)uVar58, uVar58 < 0x10000)) {
              lVar51 = (long)(int)local_134;
              local_134 = local_134 + 1;
              local_80[lVar51 + 1][0] = *(undefined8 *)(pTVar68 + 6);
              local_80[lVar51 + 1][1] = *(undefined8 *)(pTVar68 + 8);
              goto LAB_00a1fb20;
            }
            goto LAB_00a2117a;
          }
switchD_00a1ea86_caseD_5:
          uVar45 = s->reserved_regs;
          uVar44 = (ulong)uVar45;
          TVar20 = pTVar68[0x1c];
          pTVar28 = *(TCGTemp **)(pTVar68 + 6);
          ts = *(TCGTemp **)(pTVar68 + 8);
          bVar18 = pTVar28->field_0x3;
          uVar58 = *(ulong *)ts;
          if ((char)(uVar58 >> 8) == '\x02') {
            temp_load(s,ts,s->tcg_target_available_regs[(uint)uVar58 >> 0x18],uVar45,TVar20);
            uVar58 = *(ulong *)ts;
          }
          else if (((uint)(uVar58 >> 8) & 0xff) == 3) {
            tVar7 = ts->val;
            if (((TVar47 >> 0x13 & 1) != 0) && ((uVar58 & 0x100000000) == 0)) {
              if (((uint)uVar58 & 0xff00) == 0x100) {
                ppTVar2[uVar58 & 0xff] = (TCGTemp *)0x0;
                uVar58 = *(ulong *)ts;
              }
              uVar69 = uVar58 >> 0x1c & 0x200;
              if ((uVar58 & 0x4000000000) != 0) {
                uVar69 = 0x200;
              }
              *(ulong *)ts = uVar58 & 0xffffffffffff00ff | uVar69;
            }
            tcg_reg_alloc_do_movi(s,pTVar28,tVar7,arg_life,TVar20);
            goto LAB_00a1fb20;
          }
          uVar44 = (ulong)uVar45;
          if ((TVar47 >> 0x12 & 1) == 0) {
            uVar69 = *(ulong *)pTVar28;
            uVar36 = (uint)uVar69 & 0xff00;
            if (((TVar47 >> 0x13 & 1) == 0) || ((uVar58 & 0x100000000) != 0)) {
              if (uVar36 != 0x100) {
                uVar45 = uVar45 | 1 << ((uint)uVar58 & 0x1f);
                TVar21 = tcg_reg_alloc(s,s->tcg_target_available_regs[bVar18],uVar45,TVar20,
                                       (uVar69 & 0x400000000) != 0);
                uVar69 = *(ulong *)pTVar28 & 0xffffffffffffff00 | (ulong)(TVar21 & 0xff);
                *(ulong *)pTVar28 = uVar69;
                uVar58 = *(ulong *)ts;
              }
              tcg_out_mov(s,(uint)bVar18,(TCGReg)uVar69 & 0xff,(TCGReg)uVar58 & 0xff);
              uVar44 = (ulong)uVar45;
            }
            else {
              if (uVar36 == 0x100) {
                ppTVar2[uVar69 & 0xff] = (TCGTemp *)0x0;
                uVar58 = (ulong)*(byte *)ts;
                uVar69 = *(ulong *)pTVar28;
              }
              *(ulong *)pTVar28 = uVar69 & 0xffffffffffffff00 | uVar58 & 0xff;
              uVar58 = *(ulong *)ts;
              if ((uVar58 & 0x100000000) == 0) {
                if (((uint)uVar58 & 0xff00) == 0x100) {
                  ppTVar2[uVar58 & 0xff] = (TCGTemp *)0x0;
                  uVar58 = *(ulong *)ts;
                }
                uVar69 = uVar58 >> 0x1c & 0x200;
                if ((uVar58 & 0x4000000000) != 0) {
                  uVar69 = 0x200;
                }
                *(ulong *)ts = uVar58 & 0xffffffffffff00ff | uVar69;
              }
            }
            uVar58 = *(ulong *)pTVar28;
            *(ulong *)pTVar28 = uVar58 & 0xfffffff7ffff00ff | 0x100;
            ppTVar2[uVar58 & 0xff] = pTVar28;
            if ((TVar47 >> 0x10 & 1) != 0) {
              temp_sync(s,pTVar28,(TCGRegSet)uVar44,0,0);
            }
            goto LAB_00a1fb20;
          }
          if ((pTVar28->field_0x4 & 0x10) == 0) {
            temp_allocate_frame(s,pTVar28);
            uVar58 = *(ulong *)ts;
          }
          tcg_out_st(s,(uint)bVar18,(TCGReg)uVar58 & 0xff,(uint)*(byte *)pTVar28->mem_base,
                     pTVar28->mem_offset);
          if (((TVar47 >> 0x13 & 1) != 0) && (uVar58 = *(ulong *)ts, (uVar58 & 0x100000000) == 0)) {
            if (((uint)uVar58 & 0xff00) == 0x100) {
              ppTVar2[uVar58 & 0xff] = (TCGTemp *)0x0;
              uVar58 = *(ulong *)ts;
            }
            uVar69 = uVar58 >> 0x1c & 0x200;
            if ((uVar58 & 0x4000000000) != 0) {
              uVar69 = 0x200;
            }
            *(ulong *)ts = uVar58 & 0xffffffffffff00ff | uVar69;
          }
          uVar58 = *(ulong *)pTVar28;
        }
        else {
          if (TVar20 != INDEX_op_dup_vec) {
            if (TVar20 == INDEX_op_dupi_vec) goto switchD_00a1ea86_caseD_6;
            if (TVar20 != INDEX_op_mov_vec) goto switchD_00a1ea86_caseD_3;
            goto switchD_00a1ea86_caseD_5;
          }
          pTVar28 = *(TCGTemp **)(pTVar68 + 6);
          puVar9 = *(ulong **)(pTVar68 + 8);
          uVar58 = *puVar9;
          cVar41 = (char)(uVar58 >> 8);
          if (cVar41 == '\x03') {
            tVar7 = puVar9[1];
            if (((TVar47 >> 0x13 & 1) != 0) && ((uVar58 & 0x100000000) == 0)) {
              if (((uint)uVar58 & 0xff00) == 0x100) {
                ppTVar2[uVar58 & 0xff] = (TCGTemp *)0x0;
                uVar58 = *puVar9;
              }
              uVar44 = uVar58 >> 0x1c & 0x200;
              if ((uVar58 & 0x4000000000) != 0) {
                uVar44 = 0x200;
              }
              *puVar9 = uVar58 & 0xffffffffffff00ff | uVar44;
            }
            tcg_reg_alloc_do_movi(s,pTVar28,tVar7,arg_life,pTVar68[0x1c]);
            uVar44 = in_R9;
            goto LAB_00a1fb20;
          }
          pTVar10 = s->tcg_op_defs[0x8b].args_ct;
          uVar45 = pTVar10[1].u.regs;
          uVar69 = uVar58;
          if (((uint)*(ulong *)pTVar28 & 0xff00) != 0x100) {
            uVar36 = 1 << ((byte)uVar58 & 0x1f);
            if (cVar41 != '\x01' || (TVar47 & 0x80000) != INDEX_op_discard) {
              uVar36 = 0;
            }
            TVar21 = tcg_reg_alloc(s,(pTVar10->u).regs,uVar36 | s->reserved_regs,pTVar68[0x1c],
                                   (*(ulong *)pTVar28 & 0x400000000) != 0);
            *(ulong *)pTVar28 =
                 (*(ulong *)pTVar28 & 0xfffffff7ffff0000) + (ulong)(TVar21 & 0xff) + 0x100;
            s->reg_to_temp[TVar21 & 0xff] = pTVar28;
            uVar69 = *puVar9;
            uVar44 = in_R9;
          }
          uVar36 = TVar47 >> 0xc & 0xf;
          TVar49 = (TVar47 >> 8 & 0xf) + TCG_TYPE_V64;
          if ((char)(uVar69 >> 8) == '\x01') {
            TVar21 = (TCGReg)uVar69 & 0xff;
            if ((uVar45 >> ((TCGReg)uVar69 & TCG_REG_XMM15) & 1) == 0) {
              bVar18 = (byte)*(undefined8 *)pTVar28;
              if ((uVar69 >> 0x23 & 1) != 0) goto LAB_00a1f7b8;
              tcg_out_mov(s,(TCGType)(uVar58 >> 0x18) & 0xff,(TCGReg)*(undefined8 *)pTVar28 & 0xff,
                          TVar21);
              bVar18 = *(byte *)pTVar28;
              TVar21 = (TCGReg)bVar18;
            }
            else {
              bVar18 = *(byte *)pTVar28;
            }
            tcg_out_dup_vec(s,TVar49,uVar36,(uint)bVar18,TVar21);
          }
          else {
            if (((uint)(uVar69 >> 8) & 0xff) != 2) {
              pcVar25 = 
              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
              ;
              iVar23 = 0xd22;
              goto LAB_00a211a5;
            }
            bVar18 = (byte)*(undefined8 *)pTVar28;
LAB_00a1f7b8:
            uVar44 = puVar9[3];
            tcg_out_dupm_vec(s,TVar49,uVar36,(uint)bVar18,(uint)*(byte *)puVar9[2],uVar44);
          }
          if (((TVar47 >> 0x13 & 1) != 0) && (uVar58 = *puVar9, (uVar58 & 0x100000000) == 0)) {
            if (((uint)uVar58 & 0xff00) == 0x100) {
              ppTVar2[uVar58 & 0xff] = (TCGTemp *)0x0;
              uVar58 = *puVar9;
            }
            uVar69 = uVar58 >> 0x1c & 0x200;
            if ((uVar58 & 0x4000000000) != 0) {
              uVar69 = 0x200;
            }
            *puVar9 = uVar58 & 0xffffffffffff00ff | uVar69;
          }
          if ((TVar47 >> 0x10 & 1) != 0) {
            temp_sync(s,pTVar28,s->reserved_regs,0,0);
          }
          if ((TVar47 >> 0x12 & 1) == 0) goto LAB_00a1fb20;
          uVar58 = *(ulong *)pTVar28;
        }
        if ((uVar58 & 0x100000000) == 0) {
          if (((uint)uVar58 & 0xff00) == 0x100) {
            ppTVar2[uVar58 & 0xff] = (TCGTemp *)0x0;
            uVar58 = *(ulong *)pTVar28;
          }
          uVar69 = uVar58 >> 0x1c & 0x200;
          if ((uVar58 & 0x4000000000) != 0) {
            uVar69 = 0x200;
          }
          *(ulong *)pTVar28 = uVar58 & 0xffffffffffff00ff | uVar69;
        }
        goto LAB_00a1fb20;
      }
      switch(TVar47 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64)) {
      case INDEX_op_discard:
        puVar9 = *(ulong **)(pTVar68 + 6);
        uVar58 = *puVar9;
        if ((uVar58 & 0x100000000) == 0) {
          if (((uint)uVar58 & 0xff00) == 0x100) {
            ppTVar2[uVar58 & 0xff] = (TCGTemp *)0x0;
            uVar58 = *puVar9;
          }
          uVar69 = uVar58 >> 0x1c & 0x200;
          if ((uVar58 & 0x4000000000) != 0) {
            uVar69 = 0x200;
          }
          *puVar9 = uVar58 & 0xffffffffffff00ff | uVar69;
        }
        goto LAB_00a1fb20;
      case INDEX_op_set_label:
        puVar12 = *(uint **)(pTVar68 + 6);
        ptVar31 = s->code_ptr;
        *puVar12 = *puVar12 | 2;
        *(tcg_insn_unit **)(puVar12 + 2) = ptVar31;
        goto LAB_00a1fb20;
      case INDEX_op_call:
        uVar36 = TVar47 >> 8 & 0xf;
        uVar45 = 6;
        if (uVar36 < 6) {
          uVar45 = TVar47 >> 8 & 0xf;
        }
        if (((long)(int)(uVar36 - uVar45) * 8 + 0xfU & 0xfffffffffffffff0) < 0x81) {
          uVar46 = TVar47 >> 0xc & 0xf;
          uVar58 = (ulong)uVar46;
          ptVar31 = *(tcg_insn_unit **)(pTVar68 + (ulong)(uVar46 + uVar36) * 2 + 6);
          if (6 < uVar36) {
            lVar51 = 0;
            do {
              pTVar28 = *(TCGTemp **)((long)pTVar68 + lVar51 + uVar58 * 8 + 0x48);
              if (pTVar28 != (TCGTemp *)0x0) {
                temp_load(s,pTVar28,s->tcg_target_available_regs[(byte)pTVar28->field_0x3],
                          s->reserved_regs,0);
                tcg_out_st(s,*(TCGReg *)pTVar28 >> 0x18,*(TCGReg *)pTVar28 & 0xff,TCG_REG_CALL_STACK
                           ,lVar51);
              }
              lVar51 = lVar51 + 8;
            } while ((ulong)uVar36 * 8 + -0x30 != lVar51);
          }
          uVar57 = TVar47 >> 0x10;
          uVar24 = s->reserved_regs;
          uVar44 = in_R9;
          if ((TVar47 & 0xf00) != INDEX_op_discard) {
            uVar44 = 0;
            do {
              pTVar28 = *(TCGTemp **)((long)pTVar68 + uVar44 * 2 + uVar58 * 8 + 0x18);
              if (pTVar28 != (TCGTemp *)0x0) {
                TVar21 = *(TCGReg *)((long)tcg_target_call_iarg_regs + uVar44);
                TVar48 = (TCGReg)*(undefined8 *)pTVar28;
                if ((TVar48 & 0xff00) == 0x100) {
                  arg = TVar48 & 0xff;
                  if (arg != TVar21) {
                    if (ppTVar2[TVar21] != (TCGTemp *)0x0) {
                      temp_sync(s,ppTVar2[TVar21],uVar24,0,-1);
                      TVar48 = *(TCGReg *)pTVar28;
                      arg = TVar48 & 0xff;
                    }
                    tcg_out_mov(s,TVar48 >> 0x18,TVar21,arg);
                  }
                }
                else {
                  if (ppTVar2[TVar21] != (TCGTemp *)0x0) {
                    temp_sync(s,ppTVar2[TVar21],uVar24,0,-1);
                  }
                  temp_load(s,pTVar28,1 << ((byte)TVar21 & 0x1f),uVar24,0);
                }
                uVar24 = uVar24 | 1 << (TVar21 & TCG_REG_XMM15);
              }
              uVar44 = uVar44 + 4;
              uVar69 = uVar58;
            } while (uVar45 << 2 != uVar44);
            do {
              if ((uVar57 >> ((byte)uVar69 & 0x1f) & 4) != 0) {
                puVar9 = *(ulong **)(pTVar68 + uVar69 * 2 + 6);
                uVar44 = *puVar9;
                if ((uVar44 & 0x100000000) == 0) {
                  if (((uint)uVar44 & 0xff00) == 0x100) {
                    ppTVar2[uVar44 & 0xff] = (TCGTemp *)0x0;
                    uVar44 = *puVar9;
                  }
                  uVar37 = uVar44 >> 0x1c & 0x200;
                  if ((uVar44 & 0x4000000000) != 0) {
                    uVar37 = 0x200;
                  }
                  *puVar9 = uVar44 & 0xffffffffffff00ff | uVar37;
                }
              }
              uVar69 = uVar69 + 1;
              uVar44 = (ulong)uVar57;
            } while (uVar69 < uVar46 + uVar36);
          }
          lVar51 = 0;
          do {
            if (((s->tcg_target_call_clobber_regs >> ((uint)lVar51 & 0x1f) & 1) != 0) &&
               (s->reg_to_temp[lVar51] != (TCGTemp *)0x0)) {
              temp_sync(s,s->reg_to_temp[lVar51],uVar24,0,-1);
            }
            lVar51 = lVar51 + 1;
          } while (lVar51 != 0x20);
          tcg_out_branch(s,1,ptVar31);
          if (uVar46 != 0) {
            uVar69 = 0;
            do {
              pTVar28 = *(TCGTemp **)(pTVar68 + uVar69 * 2 + 6);
              uVar37 = *(ulong *)pTVar28;
              if (((uint)uVar37 & 0xff00) == 0x100) {
                ppTVar2[uVar37 & 0xff] = (TCGTemp *)0x0;
                uVar37 = *(ulong *)pTVar28;
              }
              *(ulong *)pTVar28 = uVar37 & 0xfffffff7ffff0000 | 0x100;
              *ppTVar2 = pTVar28;
              uVar45 = 4 << ((byte)uVar69 & 0x1f) & uVar57;
              if ((uVar57 >> ((uint)uVar69 & 0x1f) & 1) == 0) {
                if ((uVar45 != 0) && (uVar37 = *(ulong *)pTVar28, (uVar37 & 0x100000000) == 0)) {
                  if (((uint)uVar37 & 0xff00) == 0x100) {
                    ppTVar2[uVar37 & 0xff] = (TCGTemp *)0x0;
                    uVar37 = *(ulong *)pTVar28;
                  }
                  uVar52 = uVar37 >> 0x1c & 0x200;
                  if ((uVar37 & 0x4000000000) != 0) {
                    uVar52 = 0x200;
                  }
                  *(ulong *)pTVar28 = uVar37 & 0xffffffffffff00ff | uVar52;
                }
              }
              else {
                temp_sync(s,pTVar28,uVar24,0,uVar45);
              }
              uVar69 = uVar69 + 1;
            } while (uVar58 != uVar69);
          }
          goto LAB_00a1fb20;
        }
        goto LAB_00a21175;
      case INDEX_op_mov_i32:
        goto switchD_00a1ea86_caseD_5;
      case INDEX_op_movi_i32:
switchD_00a1ea86_caseD_6:
        tcg_reg_alloc_do_movi
                  (s,*(TCGTemp **)(pTVar68 + 6),*(undefined8 *)(pTVar68 + 8),arg_life,pTVar68[0x1c])
        ;
        uVar44 = in_R9;
        goto LAB_00a1fb20;
      }
switchD_00a1ea86_caseD_3:
      tcg_op_supported_sparc64(TVar47 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64));
      uVar45 = TVar47 >> 0x10;
      pTVar8 = s->tcg_op_defs;
      uVar58 = (ulong)((TVar47 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64)) << 5);
      uVar44 = (ulong)(&pTVar8->nb_oargs)[uVar58];
      bVar18 = (&pTVar8->nb_iargs)[uVar58];
      lVar51 = (ulong)(&pTVar8->nb_oargs)[uVar58] * 8;
      s_00 = (TCGContext_conflict8 *)
             ((long)&stack0xfffffffffffffef8 + (ulong)((uint)bVar18 * 8) + lVar51);
      memcpy(s_00,(void *)((long)pTVar68 + (ulong)((uint)bVar18 * 8) + lVar51 + 0x18),
             (ulong)(&pTVar8->nb_cargs)[uVar58] << 3);
      TVar61 = s->reserved_regs;
      allocated_regs = TVar61;
      if (bVar18 != 0) {
        uVar69 = 0;
        do {
          lVar51 = *(long *)((long)&pTVar8->args_ct + uVar58);
          lVar66 = *(long *)((long)&pTVar8->sorted_args + uVar58);
          iVar23 = *(int *)(lVar66 + uVar69 * 4 + uVar44 * 4);
          lVar62 = (long)iVar23;
          pTVar28 = *(TCGTemp **)(pTVar68 + lVar62 * 2 + 6);
          uVar37 = *(ulong *)pTVar28;
          uVar36 = (uint)uVar37 & 0xff00;
          uVar4 = *(ushort *)(lVar51 + lVar62 * 8);
          if ((uVar36 == 0x300) &&
             ((((uVar52 = pTVar28->val, (uVar4 & 2) != 0 ||
                (((uVar4 >> 8 & 1) != 0 && (uVar52 + 0x80000000 >> 0x20 == 0)))) ||
               (((uVar4 >> 9 & 1) != 0 && (uVar52 >> 0x20 == 0)))) ||
              ((((uVar4 >> 10 & 1) != 0 && (uVar52 + 0x80000000 >> 0x20 == 0)) ||
               (((uVar4 >> 0xb & 1) != 0 &&
                ((ulong)((char)(uVar37 >> 0x18) != '\0') * 0x20 + 0x20 == uVar52)))))))) {
            *(undefined4 *)((long)&stack0xffffffffffffff88 + lVar62 * 4) = 1;
            *(ulong *)((long)&stack0xfffffffffffffef8 + lVar62 * 8) = uVar52;
          }
          else {
            TVar47 = INDEX_op_discard;
            if ((uVar4 & 0x40) == 0) {
              TVar20 = INDEX_op_discard;
LAB_00a1f30b:
              temp_load(s,pTVar28,*(TCGRegSet *)(lVar51 + 4 + lVar62 * 8),allocated_regs,TVar47);
              uVar37 = *(ulong *)pTVar28;
              bVar35 = (byte)uVar37;
              if ((*(uint *)(lVar51 + 4 + lVar62 * 8) >> ((uint)uVar37 & 0x1f) & 1) == 0)
              goto LAB_00a1f33f;
              uVar37 = uVar37 & 0xff;
            }
            else {
              uVar52 = (ulong)*(byte *)(lVar51 + 2 + lVar62 * 8);
              TVar20 = pTVar68[uVar52 + 0x1c];
              if ((uVar37 & 0x100000000) == 0) {
                if ((uVar45 >> ((byte)iVar23 & 0x1f) & 4) != 0) {
                  TVar47 = TVar20;
                  if ((uVar36 == 0x100) && (uVar69 != 0)) {
                    uVar52 = 0;
                    do {
                      lVar54 = (long)*(int *)(lVar66 + uVar44 * 4 + uVar52 * 4);
                      if (((*(byte *)(lVar51 + lVar54 * 8) & 0x40) != 0) &&
                         ((uVar37 & 0xff) == *(ulong *)((long)&stack0xfffffffffffffef8 + lVar54 * 8)
                         )) goto LAB_00a1f33f;
                      uVar52 = uVar52 + 1;
                    } while (uVar69 != uVar52);
                  }
                  goto LAB_00a1f30b;
                }
              }
              else if (pTVar28 == *(TCGTemp **)(pTVar68 + uVar52 * 2 + 6)) goto LAB_00a1f30b;
LAB_00a1f33f:
              temp_load(s,pTVar28,s->tcg_target_available_regs[uVar37 >> 0x18 & 0xff],allocated_regs
                        ,0);
              TVar21 = tcg_reg_alloc(s,*(TCGRegSet *)(lVar51 + 4 + lVar62 * 8),allocated_regs,TVar20
                                     ,((undefined1  [56])*pTVar28 & (undefined1  [56])0x400000000)
                                      != (undefined1  [56])0x0);
              uVar37 = (ulong)TVar21;
              tcg_out_mov(s,*(TCGReg *)pTVar28 >> 0x18,TVar21,*(TCGReg *)pTVar28 & 0xff);
              bVar35 = (byte)TVar21;
            }
            *(ulong *)((long)&stack0xfffffffffffffef8 + lVar62 * 8) = uVar37;
            *(undefined4 *)((long)&stack0xffffffffffffff88 + lVar62 * 4) = 0;
            allocated_regs = allocated_regs | 1 << (bVar35 & 0x1f);
          }
          uVar69 = uVar69 + 1;
        } while (uVar69 != bVar18);
        s_00 = (TCGContext_conflict8 *)0x100000000;
        in_R9 = 0x200;
        uVar69 = uVar44;
        do {
          if ((uVar45 >> ((byte)uVar69 & 0x1f) & 4) != 0) {
            puVar9 = *(ulong **)(pTVar68 + uVar69 * 2 + 6);
            uVar37 = *puVar9;
            if ((uVar37 & 0x100000000) == 0) {
              if (((uint)uVar37 & 0xff00) == 0x100) {
                ppTVar2[uVar37 & 0xff] = (TCGTemp *)0x0;
                uVar37 = *puVar9;
              }
              uVar52 = uVar37 >> 0x1c & 0x200;
              if ((uVar37 & 0x4000000000) != 0) {
                uVar52 = 0x200;
              }
              *puVar9 = uVar37 & 0xffffffffffff00ff | uVar52;
            }
          }
          uVar69 = uVar69 + 1;
        } while (uVar69 < bVar18 + uVar44);
      }
      iVar23 = (int)in_R9;
      if (((&pTVar8->flags)[uVar58] & 2) == 0) {
        if (((&pTVar8->flags)[uVar58] & 4) != 0) {
          lVar51 = 0;
          do {
            s_00 = s;
            if (((s->tcg_target_call_clobber_regs >> ((uint)lVar51 & 0x1f) & 1) != 0) &&
               (s->reg_to_temp[lVar51] != (TCGTemp *)0x0)) {
              temp_sync(s,s->reg_to_temp[lVar51],allocated_regs,0,-1);
            }
            lVar51 = lVar51 + 1;
          } while (lVar51 != 0x20);
        }
        iVar23 = (int)in_R9;
        if (uVar44 != 0) {
          uVar69 = 0;
          do {
            lVar51 = *(long *)((long)&pTVar8->args_ct + uVar58);
            lVar66 = (long)*(int *)(*(long *)((long)&pTVar8->sorted_args + uVar58) + uVar69 * 4);
            pTVar28 = *(TCGTemp **)(pTVar68 + lVar66 * 2 + 6);
            uVar4 = *(ushort *)(lVar51 + lVar66 * 8);
            if (((char)uVar4 < '\0') &&
               (uVar37 = (ulong)*(byte *)(lVar51 + 2 + lVar66 * 8),
               *(int *)((long)&stack0xffffffffffffff88 + uVar37 * 4) == 0)) {
              TVar21 = *(TCGReg *)((long)&stack0xfffffffffffffef8 + uVar37 * 8);
            }
            else {
              if ((uVar4 & 0x20) == 0) {
                TVar47 = pTVar68[uVar69 + 0x1c];
                uVar36 = TVar61;
              }
              else {
                uVar36 = TVar61 | allocated_regs;
                TVar47 = pTVar68[uVar69 + 0x1c];
              }
              s_00 = s;
              TVar21 = tcg_reg_alloc(s,*(TCGRegSet *)(lVar51 + 4 + lVar66 * 8),uVar36,TVar47,
                                     ((undefined1  [56])*pTVar28 & (undefined1  [56])0x400000000) !=
                                     (undefined1  [56])0x0);
            }
            iVar23 = (int)in_R9;
            uVar37 = *(ulong *)pTVar28;
            if (((uint)uVar37 & 0xff00) == 0x100) {
              ppTVar2[uVar37 & 0xff] = (TCGTemp *)0x0;
              uVar37 = *(ulong *)pTVar28;
            }
            TVar61 = TVar61 | 1 << (TVar21 & TCG_REG_XMM15);
            *(ulong *)pTVar28 = (uVar37 & 0xfffffff7ffff0000) + (ulong)(byte)TVar21 + 0x100;
            ppTVar2[TVar21] = pTVar28;
            *(ulong *)((long)&stack0xfffffffffffffef8 + lVar66 * 8) = (ulong)TVar21;
            uVar69 = uVar69 + 1;
          } while (uVar44 != uVar69);
        }
      }
      uVar69 = local_e8;
      pTVar15 = local_f8;
      pTVar59 = local_100;
      pTVar39 = local_108;
      TVar47 = *pTVar68;
      r = (TCGCond)local_108;
      bVar64 = (byte)local_108;
      bVar18 = (byte)local_100;
      base = (TCGCond)local_100;
      bVar35 = (byte)local_f8;
      TVar50 = (TCGCond)local_f8;
      if (((&pTVar8->flags)[uVar58] & 0x40) == 0) {
        uVar36 = (TVar47 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64)) - INDEX_op_br;
        if (0x85 < uVar36) {
switchD_00a1f639_caseD_5:
          tcg_gen_code_sparc64_cold_3();
          uVar45 = s_00->nb_globals;
          uVar36 = s_00->nb_temps;
          uVar24 = uVar36 * 4 + 7;
          uVar46 = uVar36 * 4 + 0xe;
          if (-1 < (int)uVar24) {
            uVar46 = uVar24;
          }
          puVar32 = s_00->pool_cur;
          if (s_00->pool_end < puVar32 + (int)(uVar46 & 0xfffffff8)) {
            puVar32 = (uint8_t *)tcg_malloc_internal_sparc64(s_00,uVar46 & 0xfffffff8);
          }
          else {
            s_00->pool_cur = puVar32 + (int)(uVar46 & 0xfffffff8);
          }
          if (0 < (int)uVar36) {
            lVar51 = (ulong)uVar36 - 1;
            auVar72._8_4_ = (int)lVar51;
            auVar72._0_8_ = lVar51;
            auVar72._12_4_ = (int)((ulong)lVar51 >> 0x20);
            lVar51 = 0;
            auVar72 = auVar72 ^ _DAT_00d58680;
            auVar73 = _DAT_00d58670;
            do {
              auVar74 = auVar73 ^ _DAT_00d58680;
              if ((bool)(~(auVar74._4_4_ == auVar72._4_4_ && auVar72._0_4_ < auVar74._0_4_ ||
                          auVar72._4_4_ < auVar74._4_4_) & 1)) {
                *(uint8_t **)((long)&s_00->temps[0].state_ptr + lVar51) = puVar32;
              }
              if ((auVar74._12_4_ != auVar72._12_4_ || auVar74._8_4_ <= auVar72._8_4_) &&
                  auVar74._12_4_ <= auVar72._12_4_) {
                *(uint8_t **)((long)&s_00->temps[1].state_ptr + lVar51) = puVar32 + 4;
              }
              lVar66 = auVar73._8_8_;
              auVar73._0_8_ = auVar73._0_8_ + 2;
              auVar73._8_8_ = lVar66 + 2;
              lVar51 = lVar51 + 0x70;
              puVar32 = puVar32 + 8;
            } while ((ulong)(uVar36 + 1 >> 1) * 0x70 - lVar51 != 0);
          }
          la_func_end(s_00,uVar45,uVar36);
          pQStackY_1e0 = ((s_00->ops).tqh_circ.tql_prev)->tql_prev;
          if ((TCGOp *)pQStackY_1e0->tql_next == (TCGOp *)0x0) goto LAB_00a219d9;
          lVar51 = (ulong)uVar45 * 0x38;
          pTVar56 = (TCGOp *)pQStackY_1e0->tql_next;
          do {
            pTVar5 = (TCGOp *)((pTVar56->link).tqe_circ.tql_prev)->tql_prev->tql_next;
            uVar46 = *(uint *)pTVar56;
            uVar24 = uVar46 & 0xff;
            pQVar33 = (QTailQLink *)(ulong)uVar24;
            uVar57 = uVar24 << 5;
            pTVar8 = s_00->tcg_op_defs;
            if (uVar24 < 0x7b) {
              if (0x27 < uVar24) {
                pQVar40 = (QTailQLink *)0x13;
                if (1 < uVar24 - 0x29) {
                  if (uVar24 == 0x28) {
                    pQVar40 = (QTailQLink *)0x12;
                    goto LAB_00a21407;
                  }
                  goto switchD_00a213ae_caseD_7f;
                }
LAB_00a213c9:
                bVar18 = 2;
                bStackY_1f9 = 2;
                pQStackY_1e0 = pQVar33;
                if (*(long *)(pTVar56->args[1] + 0x28) == 1) {
                  TVar43 = pTVar56->args[0];
                  lVar66 = 0x30;
                  goto LAB_00a2141d;
                }
LAB_00a2146d:
                uStackY_1cc = (uint)bStackY_1f9;
LAB_00a21478:
                uVar46 = (uint)bVar18;
                uVar44 = 0;
                uVar24 = 0;
                do {
                  TVar43 = pTVar56->args[uVar44];
                  pTVar11 = *(TCGRegSet **)(TVar43 + 0x30);
                  pTVar56->output_pref[uVar44] = *pTVar11;
                  uVar53 = 4 << ((byte)uVar44 & 0x1f);
                  if ((*(ulong *)(TVar43 + 0x28) & 1) == 0) {
                    uVar53 = 0;
                  }
                  uVar55 = 1 << ((byte)uVar44 & 0x1f);
                  if ((*(ulong *)(TVar43 + 0x28) & 2) == 0) {
                    uVar55 = 0;
                  }
                  uVar24 = uVar24 | uVar55 | uVar53;
                  *(undefined8 *)(TVar43 + 0x28) = 1;
                  *pTVar11 = 0;
                  uVar44 = uVar44 + 1;
                } while (bVar18 != uVar44);
                uVar44 = (ulong)bVar18;
                goto LAB_00a214d0;
              }
              if (uVar24 == 0) {
                TVar43 = pTVar56->args[0];
                *(undefined8 *)(TVar43 + 0x28) = 1;
                pQStackY_1e0 = *(QTailQLink **)(TVar43 + 0x30);
                *(undefined4 *)&pQStackY_1e0->tql_next = 0;
                goto switchD_00a213ae_caseD_81;
              }
              if (uVar24 != 2) {
                pQVar40 = (QTailQLink *)0x11;
                if (uVar24 == 0x27) goto LAB_00a21407;
                goto switchD_00a213ae_caseD_7f;
              }
              uVar24 = uVar46 >> 0xc & 0xf;
              uVar44 = (ulong)uVar24;
              uVar46 = uVar46 >> 8 & 0xf;
              TVar43 = pTVar56->args[(ulong)(uVar24 + uVar46) + 1];
              if ((TVar43 & 4) != 0) {
                if (uVar24 != 0) {
                  uVar58 = 0;
                  do {
                    if (*(long *)(pTVar56->args[uVar58] + 0x28) != 1) goto LAB_00a21695;
                    uVar58 = uVar58 + 1;
                  } while (uVar44 != uVar58);
                }
                goto LAB_00a21424;
              }
LAB_00a21695:
              if (uVar24 == 0) {
                uVar57 = 0;
              }
              else {
                uVar58 = 0;
                uVar57 = 0;
                do {
                  TVar6 = pTVar56->args[uVar58];
                  uVar53 = 0;
                  if ((*(ulong *)(TVar6 + 0x28) & 1) != 0) {
                    uVar53 = 4 << ((byte)uVar58 & 0x1f);
                  }
                  uVar55 = 0;
                  if ((*(ulong *)(TVar6 + 0x28) & 2) != 0) {
                    uVar55 = 1 << ((byte)uVar58 & 0x1f);
                  }
                  uVar57 = uVar57 | uVar55 | uVar53;
                  *(undefined8 *)(TVar6 + 0x28) = 1;
                  **(undefined4 **)(TVar6 + 0x30) = 0;
                  pTVar56->output_pref[uVar58] = 0;
                  uVar58 = uVar58 + 1;
                } while (uVar44 != uVar58);
              }
              uVar67 = (undefined2)uVar57;
              if ((TVar43 & 3) == 0) {
                if (0 < (int)uVar45) {
                  lVar66 = 0;
                  do {
                    *(undefined8 *)((long)&s_00->temps[0].state + lVar66) = 3;
                    **(TCGRegSet **)((long)&s_00->temps[0].state_ptr + lVar66) =
                         s_00->tcg_target_available_regs[(byte)(&s_00->temps[0].field_0x3)[lVar66]];
                    lVar66 = lVar66 + 0x38;
                  } while (lVar51 != lVar66);
                }
              }
              else if ((TVar43 & 1) == 0) {
                la_global_sync(s_00,uVar45);
              }
              uVar58 = uVar44;
              if (uVar46 == 0) {
                la_cross_call(s_00,uVar36);
                pQStackY_1e0 = extraout_RAX_01;
              }
              else {
                do {
                  if ((pTVar56->args[uVar58] != 0) &&
                     ((*(byte *)(pTVar56->args[uVar58] + 0x28) & 1) != 0)) {
                    uVar57 = uVar57 | 4 << ((byte)uVar58 & 0x1f);
                  }
                  uVar67 = (undefined2)uVar57;
                  uVar58 = uVar58 + 1;
                } while (uVar58 < uVar24 + uVar46);
                la_cross_call(s_00,uVar36);
                pQStackY_1e0 = extraout_RAX_00;
                if (uVar46 != 0) {
                  pQStackY_1e0 = (QTailQLink *)(pTVar56->args + uVar44);
                  uVar44 = 0;
                  do {
                    pvVar13 = (&pQStackY_1e0->tql_next)[uVar44];
                    if ((pvVar13 != (void *)0x0) &&
                       (uVar58 = *(ulong *)((long)pvVar13 + 0x28), (uVar58 & 1) != 0)) {
                      TVar61 = 0;
                      if (5 < uVar44) {
                        TVar61 = s_00->tcg_target_available_regs[*(byte *)((long)pvVar13 + 3)];
                      }
                      **(TCGRegSet **)((long)pvVar13 + 0x30) = TVar61;
                      *(ulong *)((long)pvVar13 + 0x28) = uVar58 & 0xfffffffffffffffe;
                    }
                    uVar44 = uVar44 + 1;
                  } while (uVar46 != uVar44);
                  if (uVar46 != 0) {
                    if (5 < uVar46) {
                      uVar46 = 6;
                    }
                    uVar44 = 0;
                    do {
                      lVar66 = *(long *)((long)&pQStackY_1e0->tql_next + uVar44 * 2);
                      if (lVar66 != 0) {
                        puVar12 = *(uint **)(lVar66 + 0x30);
                        *puVar12 = *puVar12 |
                                   1 << (*(byte *)((long)tcg_target_call_iarg_regs + uVar44) & 0x1f)
                        ;
                      }
                      uVar44 = uVar44 + 4;
                    } while (uVar46 << 2 != uVar44);
                  }
                }
              }
            }
            else {
              if (uVar24 - 0x7b < 7) {
                pQStackY_1e0 = (QTailQLink *)
                               ((long)&switchD_00a213ae::switchdataD_00da6188 +
                               (long)(int)(&switchD_00a213ae::switchdataD_00da6188)[uVar24 - 0x7b]);
                switch(uVar24) {
                case 0x7b:
                  pQVar40 = (QTailQLink *)0x4e;
                  break;
                case 0x7c:
                  pQVar40 = (QTailQLink *)0x4f;
                  break;
                default:
                  pQVar40 = (QTailQLink *)0x50;
                  goto LAB_00a213c9;
                case 0x7f:
                case 0x80:
                  goto switchD_00a213ae_caseD_7f;
                case 0x81:
                  goto switchD_00a213ae_caseD_81;
                }
LAB_00a21407:
                if (*(long *)(pTVar56->args[1] + 0x28) == 1) {
                  TVar43 = pTVar56->args[0];
                  lVar66 = 0x38;
LAB_00a2141d:
                  if (*(long *)(TVar43 + 0x28) == 1) goto LAB_00a21424;
                  *(uint *)pTVar56 = uVar46 & 0xffffff00 | (uint)pQVar40;
                  pTVar56->args[1] = pTVar56->args[2];
                  pTVar56->args[2] = *(TCGArg *)((long)pTVar56->args + lVar66 + -0x18);
                  bStackY_1f9 = 2;
                  bVar18 = 1;
                  pQStackY_1e0 = pQVar40;
                }
                else {
                  bStackY_1f9 = 4;
                  bVar18 = 2;
                  pQStackY_1e0 = pQVar33;
                }
                goto LAB_00a2146d;
              }
switchD_00a213ae_caseD_7f:
              bVar18 = (&pTVar8->nb_oargs)[uVar57];
              bStackY_1f9 = (&pTVar8->nb_iargs)[uVar57];
              if (bVar18 != 0 && ((&pTVar8->flags)[uVar57] & 8) == 0) {
                uVar44 = 0;
                do {
                  if (*(long *)(pTVar56->args[uVar44] + 0x28) != 1) goto LAB_00a21821;
                  uVar44 = uVar44 + 1;
                } while (bVar18 != uVar44);
LAB_00a21424:
                tcg_op_remove_sparc64(s_00,pTVar56);
                pQStackY_1e0 = extraout_RAX;
switchD_00a213ae_caseD_81:
                uVar67 = 0;
                goto LAB_00a2172c;
              }
LAB_00a21821:
              uStackY_1cc = (uint)bStackY_1f9;
              pQStackY_1e0 = pQVar33;
              if (bVar18 != 0) goto LAB_00a21478;
              uVar46 = 0;
              uVar44 = 0;
              uVar24 = 0;
LAB_00a214d0:
              bVar18 = (&pTVar8->flags)[uVar57];
              if ((bVar18 & 1) == 0) {
                if ((bVar18 & 2) == 0) {
                  if (((bVar18 & 8) != 0) &&
                     (la_global_sync(s_00,uVar45), ((&pTVar8->flags)[uVar57] & 4) != 0)) {
                    la_cross_call(s_00,uVar36);
                  }
                }
                else if ((int)pQStackY_1e0 == 0x26) {
                  if (0 < (int)uVar45) {
                    lVar66 = 0;
                    do {
                      pbVar30 = (byte *)((long)&s_00->temps[0].state + lVar66);
                      *pbVar30 = *pbVar30 | 2;
                      lVar66 = lVar66 + 0x38;
                    } while (lVar51 != lVar66);
                  }
                }
                else {
                  if (0 < (int)uVar45) {
                    lVar66 = 0;
                    do {
                      *(undefined8 *)((long)&s_00->temps[0].state + lVar66) = 3;
                      **(TCGRegSet **)((long)&s_00->temps[0].state_ptr + lVar66) =
                           s_00->tcg_target_available_regs
                           [(byte)(&s_00->temps[0].field_0x3)[lVar66]];
                      lVar66 = lVar66 + 0x38;
                    } while (lVar51 != lVar66);
                  }
                  ppvVar34 = &s_00->temps[(int)uVar45].state_ptr;
                  lVar66 = (long)(int)uVar36 - (long)(int)uVar45;
                  if ((int)uVar45 < (int)uVar36) {
                    do {
                      uVar58 = *(ulong *)(ppvVar34 + -6) & 0x4000000000;
                      TVar61 = 0;
                      ppvVar34[-1] = (void *)((uVar58 >> 0x26) * 2 + 1);
                      if (uVar58 != 0) {
                        TVar61 = s_00->tcg_target_available_regs
                                 [*(ulong *)(ppvVar34 + -6) >> 0x18 & 0xff];
                      }
                      *(TCGRegSet *)*ppvVar34 = TVar61;
                      ppvVar34 = ppvVar34 + 7;
                      lVar66 = lVar66 + -1;
                    } while (lVar66 != 0);
                  }
                }
              }
              else {
                la_func_end(s_00,uVar45,uVar36);
              }
              uVar46 = uVar46 + uStackY_1cc;
              if (bStackY_1f9 != 0) {
                uVar58 = uVar44;
                do {
                  uVar53 = 0;
                  if ((*(byte *)(pTVar56->args[uVar58] + 0x28) & 1) != 0) {
                    uVar53 = 4 << ((byte)uVar58 & 0x1f);
                  }
                  uVar24 = uVar24 | uVar53;
                  uVar58 = uVar58 + 1;
                } while (uVar58 < uVar46);
                uVar58 = uVar44;
                if (bStackY_1f9 != 0) {
                  do {
                    TVar43 = pTVar56->args[uVar58];
                    uVar69 = *(ulong *)(TVar43 + 0x28);
                    if ((uVar69 & 1) != 0) {
                      **(TCGRegSet **)(TVar43 + 0x30) =
                           s_00->tcg_target_available_regs[*(byte *)(TVar43 + 3)];
                      *(ulong *)(TVar43 + 0x28) = uVar69 & 0xfffffffffffffffe;
                    }
                    uVar58 = uVar58 + 1;
                  } while (uVar58 < uVar46);
                }
              }
              uVar67 = (undefined2)uVar24;
              if (((int)pQStackY_1e0 == 5) || ((int)pQStackY_1e0 == 0x3f)) {
                if ((uVar24 & 8) != 0) {
                  pQStackY_1e0 = *(QTailQLink **)(pTVar56->args[0] + 0x30);
                  *(undefined4 *)&pQStackY_1e0->tql_next =
                       **(undefined4 **)(pTVar56->args[1] + 0x30);
                }
              }
              else if (bStackY_1f9 != 0) {
                pQStackY_1e0 = *(QTailQLink **)((long)&pTVar8->args_ct + (ulong)uVar57);
                do {
                  puVar12 = *(uint **)(pTVar56->args[uVar44] + 0x30);
                  uVar24 = *(uint *)((long)&pQStackY_1e0->tql_next + uVar44 * 8 + 4);
                  uVar57 = *puVar12 & uVar24;
                  if (((ulong)(&pQStackY_1e0->tql_next)[uVar44] & 0x40) != 0) {
                    uVar57 = uVar57 & pTVar56->output_pref
                                      [*(byte *)((long)&pQStackY_1e0->tql_next + uVar44 * 8 + 2)];
                  }
                  if (uVar57 != 0) {
                    uVar24 = uVar57;
                  }
                  *puVar12 = uVar24;
                  uVar44 = uVar44 + 1;
                } while (uVar44 < uVar46);
              }
            }
LAB_00a2172c:
            *(undefined2 *)&pTVar56->field_0x2 = uVar67;
            pTVar56 = pTVar5;
            if (pTVar5 == (TCGOp *)0x0) {
LAB_00a219d9:
              return (int)pQStackY_1e0;
            }
          } while( true );
        }
        iVar22 = 0x402f7;
        opc = 0xf7;
        iVar23 = 5;
        rexw = TCG_TYPE_I32;
        TVar49 = TCG_TYPE_I32;
        iVar65 = 0;
        type = TCG_TYPE_I32;
        uVar46 = 0;
        src = (int)local_e8;
        TVar17 = TCG_TYPE_I32;
        iVar42 = 5;
        switch(TVar47 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64)) {
        case INDEX_op_br:
          tcg_out_jxx(s,-1,local_108,(&switchD_00a1f639::switchdataD_00da5f50)[uVar36] + 0xda5f50);
          break;
        case INDEX_op_mb:
          tcg_out_mb(s,(TCGArg)local_108);
          break;
        default:
          goto switchD_00a1f639_caseD_5;
        case INDEX_op_setcond_i32:
          tcg_out_setcond32(s,_local_f0,(TCGArg)local_108,(TCGArg)local_100,(TCGArg)local_f8,
                            local_70);
          break;
        case INDEX_op_movcond_i32:
          in_stack_fffffffffffffe88 = (TCGLabel *)(ulong)_local_f0;
          tcg_out_movcond32(s,local_e0,r,base,(TCGArg)local_f8,local_70,_local_f0);
          break;
        case INDEX_op_ld8u_i32:
        case INDEX_op_ld8u_i64:
          iVar23 = 0x1b6;
          goto LAB_00a207ab;
        case INDEX_op_ld8s_i32:
          iVar23 = 0x1be;
          goto LAB_00a207ab;
        case INDEX_op_ld16u_i32:
        case INDEX_op_ld16u_i64:
          iVar23 = 0x1b7;
          goto LAB_00a207ab;
        case INDEX_op_ld16s_i32:
          iVar23 = 0x1bf;
          goto LAB_00a207ab;
        case INDEX_op_ld_i32:
        case INDEX_op_ld32u_i64:
          TVar49 = TCG_TYPE_I32;
          goto LAB_00a2089d;
        case INDEX_op_st8_i32:
        case INDEX_op_st8_i64:
          if (local_78 == 0) {
            iVar23 = 0x2088;
            goto LAB_00a207ab;
          }
          tcg_out_modrm_offset(s,0xc6,0,base,(intptr_t)local_f8);
          goto LAB_00a20789;
        case INDEX_op_st16_i32:
        case INDEX_op_st16_i64:
          if (local_78 == 0) {
            iVar23 = 0x489;
            goto LAB_00a207ab;
          }
          tcg_out_modrm_offset(s,0x4c7,0,base,(intptr_t)local_f8);
          ptVar31 = s->code_ptr;
          *(short *)ptVar31 = (short)pTVar39;
          pTVar29 = (TCGCond *)(ptVar31 + 2);
LAB_00a2087c:
          s->code_ptr = (tcg_insn_unit *)pTVar29;
          break;
        case INDEX_op_st_i32:
        case INDEX_op_st32_i64:
          if (local_78 != 0) {
            iVar23 = 199;
LAB_00a2085e:
            tcg_out_modrm_offset(s,iVar23,0,base,(intptr_t)local_f8);
            pTVar29 = (TCGCond *)s->code_ptr;
            *pTVar29 = r;
            pTVar29 = pTVar29 + 1;
            goto LAB_00a2087c;
          }
          TVar49 = TCG_TYPE_I32;
          goto LAB_00a20d3f;
        case INDEX_op_add_i32:
          goto switchD_00a1f639_caseD_11;
        case INDEX_op_sub_i32:
          goto switchD_00a1f639_caseD_12;
        case INDEX_op_mul_i32:
          goto switchD_00a1f639_caseD_13;
        case INDEX_op_div2_i32:
          goto switchD_00a1f639_caseD_18;
        case INDEX_op_divu2_i32:
          goto switchD_00a1f639_caseD_19;
        case INDEX_op_and_i32:
          iVar23 = 4;
          rexw = TCG_TYPE_I32;
          goto switchD_00a1f639_caseD_12;
        case INDEX_op_or_i32:
          iVar23 = 1;
          goto switchD_00a1f639_caseD_12;
        case INDEX_op_xor_i32:
          iVar23 = 6;
          goto switchD_00a1f639_caseD_12;
        case INDEX_op_shl_i32:
          goto switchD_00a1f639_caseD_1d;
        case INDEX_op_shr_i32:
          goto switchD_00a1f639_caseD_1e;
        case INDEX_op_sar_i32:
          TVar49 = TCG_TYPE_I32;
          goto LAB_00a203bd;
        case INDEX_op_rotl_i32:
          goto switchD_00a1f639_caseD_20;
        case INDEX_op_rotr_i32:
          iVar65 = 1;
switchD_00a1f639_caseD_20:
          TVar49 = TCG_TYPE_I32;
          goto LAB_00a2098b;
        case INDEX_op_deposit_i32:
        case INDEX_op_deposit_i64:
          if (CONCAT44(uStack_ec,_local_f0) == 8) {
            if (local_e8 != 8) goto LAB_00a211ba;
            uVar36 = r + TCG_COND_LTU >> 3 & 1 | (uint)((ulong)local_f8 >> 1) & 4;
            pbVar30 = s->code_ptr;
            if (uVar36 != 0) {
              s->code_ptr = pbVar30 + 1;
              *pbVar30 = (byte)uVar36 | 0x40;
              pbVar30 = s->code_ptr;
            }
            s->code_ptr = pbVar30 + 1;
            *pbVar30 = 0x88;
            pbVar30 = s->code_ptr;
            s->code_ptr = pbVar30 + 1;
            *pbVar30 = ((byte)(r + TCG_COND_LTU) & 7) + bVar35 * '\b' | 0xc0;
          }
          else {
            if (CONCAT44(uStack_ec,_local_f0) != 0) {
LAB_00a211ba:
              tcg_gen_code_sparc64_cold_2();
              goto LAB_00a211bf;
            }
            if (local_e8 == 0x10) {
              iVar23 = 0x489;
            }
            else {
              if (local_e8 != 8) goto LAB_00a211ba;
              iVar23 = 0x6088;
            }
            tcg_out_opc(s,iVar23,TVar50,r,0);
            pbVar30 = s->code_ptr;
            s->code_ptr = pbVar30 + 1;
            *pbVar30 = (bVar64 & 7) + bVar35 * '\b' | 0xc0;
          }
          break;
        case INDEX_op_extract_i32:
switchD_00a1f639_caseD_23:
          if (local_108 < (TCGLabel *)0x8 && local_100 < (TCGLabel *)0x4) {
            iVar23 = 0x1b6;
            goto LAB_00a205b6;
          }
          tcg_out_ext16u(s,r,base);
          iVar65 = 5;
LAB_00a20c82:
          TVar50 = TCG_COND_EQ;
          goto LAB_00a209a5;
        case INDEX_op_sextract_i32:
          if ((TCGLabel *)0x7 < local_108 || (TCGLabel *)0x3 < local_100) {
            tcg_out_opc(s,0x1bf,r,base,0);
            pbVar30 = s->code_ptr;
            s->code_ptr = pbVar30 + 1;
            *pbVar30 = (bVar18 & 7) + bVar64 * '\b' | 0xc0;
            iVar65 = 7;
            goto LAB_00a20c82;
          }
          iVar23 = 0x1be;
LAB_00a205b6:
          tcg_out_opc(s,iVar23,r,base | TCG_COND_LTU,0);
          bVar18 = bVar18 + bVar64 * '\b' + 4;
          goto LAB_00a200bd;
        case INDEX_op_extract2_i32:
          iVar23 = 0x1ac;
          goto LAB_00a20480;
        case INDEX_op_brcond_i32:
          tcg_out_brcond32(s,TVar50,(TCGArg)local_108,(TCGArg)local_100,local_74,
                           (TCGLabel *)CONCAT44(uStack_ec,_local_f0),(int)in_stack_fffffffffffffe88)
          ;
          break;
        case INDEX_op_add2_i32:
          goto switchD_00a1f639_caseD_27;
        case INDEX_op_sub2_i32:
          goto switchD_00a1f639_caseD_28;
        case INDEX_op_mulu2_i32:
          goto switchD_00a1f639_caseD_29;
        case INDEX_op_muls2_i32:
          goto switchD_00a1f639_caseD_2a;
        case INDEX_op_ext8s_i32:
          goto switchD_00a1f639_caseD_2f;
        case INDEX_op_ext16s_i32:
          goto switchD_00a1f639_caseD_30;
        case INDEX_op_ext8u_i32:
        case INDEX_op_ext8u_i64:
          tcg_out_ext8u(s,r,base);
          break;
        case INDEX_op_ext16u_i32:
        case INDEX_op_ext16u_i64:
          tcg_out_ext16u(s,r,base);
          break;
        case INDEX_op_bswap16_i32:
        case INDEX_op_bswap16_i64:
          tcg_out_rolw_8(s,r);
          break;
        case INDEX_op_bswap32_i32:
        case INDEX_op_bswap32_i64:
          TVar50 = r & (TCG_COND_LTU|TCG_COND_GE) | 0x1c8;
          goto LAB_00a204fe;
        case INDEX_op_not_i32:
          goto switchD_00a1f639_caseD_35;
        case INDEX_op_neg_i32:
          goto switchD_00a1f639_caseD_36;
        case INDEX_op_andc_i32:
          uVar36 = 0;
          goto LAB_00a206b3;
        case INDEX_op_clz_i32:
          goto switchD_00a1f639_caseD_3c;
        case INDEX_op_ctz_i32:
          goto switchD_00a1f639_caseD_3d;
        case INDEX_op_ctpop_i32:
          uVar46 = 0x201b8;
          TVar50 = base;
          goto LAB_00a20836;
        case INDEX_op_setcond_i64:
          tcg_out_setcond64(s,_local_f0,(TCGArg)local_108,(TCGArg)local_100,(TCGArg)local_f8,
                            local_70);
          break;
        case INDEX_op_movcond_i64:
          in_stack_fffffffffffffe88 = (TCGLabel *)(ulong)_local_f0;
          tcg_out_movcond64(s,local_e0,r,base,(TCGArg)local_f8,local_70,_local_f0);
          break;
        case INDEX_op_ld8s_i64:
          iVar23 = 0x11be;
          goto LAB_00a207ab;
        case INDEX_op_ld16s_i64:
          iVar23 = 0x11bf;
          goto LAB_00a207ab;
        case INDEX_op_ld32s_i64:
          iVar23 = 0x1063;
LAB_00a207ab:
          tcg_out_modrm_offset(s,iVar23,r,base,(intptr_t)local_f8);
          break;
        case INDEX_op_ld_i64:
          TVar49 = TCG_TYPE_I64;
LAB_00a2089d:
          tcg_out_ld(s,TVar49,r,base,(intptr_t)local_f8);
          break;
        case INDEX_op_st_i64:
          if (local_78 != 0) {
            iVar23 = 0x10c7;
            goto LAB_00a2085e;
          }
          TVar49 = TCG_TYPE_I64;
LAB_00a20d3f:
          tcg_out_st(s,TVar49,r,base,(intptr_t)local_f8);
          break;
        case INDEX_op_add_i64:
          rexw = 0x1000;
switchD_00a1f639_caseD_11:
          iVar23 = 0;
          if (local_108 == local_100) goto switchD_00a1f639_caseD_12;
          if (local_70 == 0) {
            if (local_108 == local_f8) {
              pTVar39 = (TCGLabel *)((ulong)local_100 & 0xffffffff);
LAB_00a20b46:
              tgen_arithr(s,rexw,r,(int)pTVar39);
              break;
            }
            in_stack_fffffffffffffe88 = (TCGLabel *)0x0;
            pTVar39 = local_f8;
          }
          else {
            in_stack_fffffffffffffe88 = local_f8;
            pTVar39 = (TCGLabel *)0xffffffffffffffff;
          }
          TVar49 = rexw | 0x8d;
LAB_00a20dae:
          TVar50 = TCG_COND_NEVER;
LAB_00a20db1:
          tcg_out_modrm_sib_offset
                    (s,TVar49,r,base,(int)pTVar39,TVar50,(intptr_t)in_stack_fffffffffffffe88);
          break;
        case INDEX_op_sub_i64:
          goto switchD_00a1f639_caseD_4f;
        case INDEX_op_mul_i64:
          uVar46 = 0x1000;
switchD_00a1f639_caseD_13:
          if (local_70 == 0) {
            uVar46 = uVar46 | 0x1af;
            pTVar59 = local_f8;
            goto LAB_00a20836;
          }
          bVar18 = (bVar64 & 7) + bVar64 * '\b' | 0xc0;
          if (TVar50 != (int)(char)bVar35) {
            tcg_out_opc(s,uVar46 | 0x69,r,r,0);
            pbVar30 = s->code_ptr;
            s->code_ptr = pbVar30 + 1;
            *pbVar30 = bVar18;
            pTVar29 = (TCGCond *)s->code_ptr;
            *pTVar29 = TVar50;
            s->code_ptr = (tcg_insn_unit *)(pTVar29 + 1);
            break;
          }
          tcg_out_opc(s,uVar46 | 0x6b,r,r,0);
          pbVar30 = s->code_ptr;
          s->code_ptr = pbVar30 + 1;
          *pbVar30 = bVar18;
          pbVar30 = s->code_ptr;
          s->code_ptr = pbVar30 + 1;
          goto LAB_00a1fcc8;
        case INDEX_op_div2_i64:
          opc = 0x10f7;
switchD_00a1f639_caseD_18:
          tcg_out_opc(s,opc,7,src,0);
          pTVar39 = (TCGLabel *)(uVar69 | 0xf8);
LAB_00a20789:
          ptVar31 = s->code_ptr;
          s->code_ptr = ptVar31 + 1;
          *ptVar31 = (tcg_insn_unit)pTVar39;
          break;
        case INDEX_op_divu2_i64:
          opc = 0x10f7;
switchD_00a1f639_caseD_19:
          tcg_out_opc(s,opc,6,src,0);
          pTVar39 = (TCGLabel *)(uVar69 & 0xffffffffffffff07 | 0xf0);
          goto LAB_00a20789;
        case INDEX_op_and_i64:
          iVar42 = 4;
          goto switchD_00a1f639_caseD_4f;
        case INDEX_op_or_i64:
          iVar42 = 1;
          goto switchD_00a1f639_caseD_4f;
        case INDEX_op_xor_i64:
          iVar42 = 6;
switchD_00a1f639_caseD_4f:
          iVar23 = iVar42;
          rexw = 0x1000;
switchD_00a1f639_caseD_12:
          rexw = rexw + iVar23;
          if (local_70 != 0) {
            iVar23 = 0;
            pTVar39 = local_f8;
LAB_00a20b3c:
            tgen_arithi(s,rexw,r,(tcg_target_long)pTVar39,iVar23);
            break;
          }
          uVar46 = (rexw & ~(TCG_TYPE_V256|TCG_TYPE_V128)) +
                   (rexw & (TCG_TYPE_V256|TCG_TYPE_V128)) * 8 + 3;
          pTVar59 = local_f8;
LAB_00a20836:
          tcg_out_opc(s,uVar46,r,TVar50,0);
LAB_00a2083b:
          bVar18 = ((byte)pTVar59 & 7) + bVar64 * '\b';
          goto LAB_00a200bd;
        case INDEX_op_shl_i64:
          TVar17 = 0x1000;
switchD_00a1f639_caseD_1d:
          TVar49 = TVar17;
          iVar22 = 0x6f7;
          iVar23 = 4;
          if ((local_108 == local_100 || local_70 == 0) ||
             (&DAT_00000002 < (undefined1 *)((long)&local_f8[-1].next.sqe_next + 7)))
          goto switchD_00a1f639_caseD_1e;
          TVar49 = TVar49 | 0x8d;
          pTVar39 = local_100;
          if (local_f8 == (TCGLabel *)&DAT_00000001) {
            in_stack_fffffffffffffe88 = (TCGLabel *)0x0;
            goto LAB_00a20dae;
          }
          in_stack_fffffffffffffe88 = (TCGLabel *)0x0;
          base = ~TCG_COND_NEVER;
          goto LAB_00a20db1;
        case INDEX_op_shr_i64:
          TVar49 = 0x1000;
          goto switchD_00a1f639_caseD_1e;
        case INDEX_op_sar_i64:
          TVar49 = 0x1000;
LAB_00a203bd:
          iVar22 = 0x202f7;
          iVar23 = 7;
switchD_00a1f639_caseD_1e:
          iVar65 = iVar23;
          if (have_bmi2 == true) {
            if (local_70 != 0) {
              tcg_out_mov(s,(uint)(TVar49 != TCG_TYPE_I32),r,base);
              goto LAB_00a20996;
            }
            tcg_out_vex_opc(s,TVar49 + iVar22,r,TVar50,base,0);
            goto LAB_00a2083b;
          }
LAB_00a2098b:
          if (local_70 != 0) {
LAB_00a20996:
            iVar65 = iVar65 + TVar49;
            goto LAB_00a209a5;
          }
          tcg_out_opc(s,TVar49 + 0xd3,iVar65,r,0);
          bVar18 = (bVar64 & 7) + (char)iVar65 * '\b';
          goto LAB_00a200bd;
        case INDEX_op_rotl_i64:
          goto switchD_00a1f639_caseD_5d;
        case INDEX_op_rotr_i64:
          iVar65 = 1;
switchD_00a1f639_caseD_5d:
          TVar49 = 0x1000;
          goto LAB_00a2098b;
        case INDEX_op_extract_i64:
          if (&local_f8->field_0x0 + CONCAT44(uStack_ec,_local_f0) != (undefined1 *)0x20)
          goto switchD_00a1f639_caseD_23;
          tcg_out_mov(s,TCG_TYPE_I32,r,base);
          iVar65 = 5;
          goto LAB_00a209a5;
        case INDEX_op_extract2_i64:
          iVar23 = 0x11ac;
LAB_00a20480:
          tcg_out_opc(s,iVar23,TVar50,r,0);
          pbVar30 = s->code_ptr;
          s->code_ptr = pbVar30 + 1;
          *pbVar30 = (bVar64 & 7) + bVar35 * '\b' | 0xc0;
          ptVar31 = s->code_ptr;
          s->code_ptr = ptVar31 + 1;
          *ptVar31 = local_f0;
          break;
        case INDEX_op_ext_i32_i64:
        case INDEX_op_ext32s_i64:
          tcg_out_ext32s(s,r,base);
          break;
        case INDEX_op_extu_i32_i64:
        case INDEX_op_extrl_i64_i32:
        case INDEX_op_ext32u_i64:
          uVar36 = (uint)((ulong)local_100 >> 3) & 1 | (uint)((ulong)local_108 >> 1) & 4;
          pbVar30 = s->code_ptr;
          if (uVar36 != 0) {
            s->code_ptr = pbVar30 + 1;
            *pbVar30 = (byte)uVar36 | 0x40;
            pbVar30 = s->code_ptr;
          }
          s->code_ptr = pbVar30 + 1;
          *pbVar30 = 0x8b;
          pbVar30 = s->code_ptr;
          s->code_ptr = pbVar30 + 1;
          *pbVar30 = (bVar18 & 7) + bVar64 * '\b' | 0xc0;
          break;
        case INDEX_op_extrh_i64_i32:
          iVar65 = 0x1005;
          TVar50 = 0x20;
LAB_00a209a5:
          tcg_out_shifti(s,iVar65,r,TVar50);
          break;
        case INDEX_op_brcond_i64:
          tcg_out_brcond64(s,TVar50,(TCGArg)local_108,(TCGArg)local_100,local_74,
                           (TCGLabel *)CONCAT44(uStack_ec,_local_f0),(int)in_stack_fffffffffffffe88)
          ;
          break;
        case INDEX_op_ext8s_i64:
          type = 0x1000;
switchD_00a1f639_caseD_2f:
          tcg_out_ext8s(s,r,base,type);
          break;
        case INDEX_op_ext16s_i64:
          type = 0x1000;
switchD_00a1f639_caseD_30:
          tcg_out_ext16s(s,r,base,type);
          break;
        case INDEX_op_bswap64_i64:
          TVar50 = r & (TCG_COND_LTU|TCG_COND_GE) | 0x11c8;
LAB_00a204fe:
          tcg_out_opc(s,TVar50,0,r,0);
          break;
        case INDEX_op_not_i64:
          opc = 0x10f7;
switchD_00a1f639_caseD_35:
          tcg_out_opc(s,opc,2,r,0);
          pTVar39 = (TCGLabel *)((ulong)pTVar39 & 0xffffffffffffff07 | 0xd0);
          goto LAB_00a20789;
        case INDEX_op_neg_i64:
          opc = 0x10f7;
switchD_00a1f639_caseD_36:
          tcg_out_opc(s,opc,3,r,0);
          pTVar39 = (TCGLabel *)((ulong)pTVar39 & 0xffffffffffffff07 | 0xd8);
          goto LAB_00a20789;
        case INDEX_op_andc_i64:
          uVar36 = 0x1000;
          type = TCG_TYPE_I64;
LAB_00a206b3:
          if (local_70 == 0) {
            tcg_out_vex_opc(s,uVar36 | 0x2f2,r,TVar50,base,0);
            pbVar30 = s->code_ptr;
            s->code_ptr = pbVar30 + 1;
            *pbVar30 = (bVar18 & 7) + bVar64 * '\b' | 0xc0;
          }
          else {
            tcg_out_mov(s,type,r,base);
            tgen_arithi(s,uVar36 | 4,r,~(ulong)pTVar15,0);
          }
          break;
        case INDEX_op_clz_i64:
          rexw = 0x1000;
switchD_00a1f639_caseD_3c:
          tcg_out_clz(s,rexw,r,base,(TCGArg)local_f8,local_70 != 0);
          break;
        case INDEX_op_ctz_i64:
          rexw = 0x1000;
switchD_00a1f639_caseD_3d:
          tcg_out_ctz(s,rexw,r,base,(TCGArg)local_f8,local_70 != 0);
          break;
        case INDEX_op_ctpop_i64:
          uVar46 = 0x211b8;
          TVar50 = base;
          goto LAB_00a20836;
        case INDEX_op_add2_i64:
          type = 0x1000;
switchD_00a1f639_caseD_27:
          if (local_68 == 0) {
            tgen_arithr(s,type,r,src);
          }
          else {
            tgen_arithi(s,type,r,local_e8,1);
          }
          rexw = type | TCG_TYPE_V64;
LAB_00a20b1b:
          pTVar39 = (TCGLabel *)CONCAT44(uStack_dc,local_e0);
          r = base;
          if (local_64 != 0) {
            iVar23 = 1;
            goto LAB_00a20b3c;
          }
          goto LAB_00a20b46;
        case INDEX_op_sub2_i64:
          type = 0x1000;
switchD_00a1f639_caseD_28:
          if (local_68 == 0) {
            tgen_arithr(s,type | TCG_TYPE_COUNT,r,src);
          }
          else {
            tgen_arithi(s,type | TCG_TYPE_COUNT,r,local_e8,1);
          }
          rexw = type | TCG_TYPE_V128;
          goto LAB_00a20b1b;
        case INDEX_op_mulu2_i64:
          opc = 0x10f7;
switchD_00a1f639_caseD_29:
          uVar58 = CONCAT44(uStack_ec,_local_f0);
          tcg_out_opc(s,opc,4,_local_f0,0);
          pTVar39 = (TCGLabel *)(uVar58 & 0xffffffffffffff07 | 0xe0);
          goto LAB_00a20789;
        case INDEX_op_muls2_i64:
          opc = 0x10f7;
switchD_00a1f639_caseD_2a:
          uVar58 = CONCAT44(uStack_ec,_local_f0);
          tcg_out_opc(s,opc,5,_local_f0,0);
          pTVar39 = (TCGLabel *)(uVar58 & 0xffffffffffffff07 | 0xe8);
          goto LAB_00a20789;
        case INDEX_op_exit_tb:
          if (local_108 == (TCGLabel *)0x0) {
            ptVar31 = (tcg_insn_unit *)s->code_gen_epilogue;
          }
          else {
            tcg_out_movi(s,TCG_TYPE_I64,TCG_REG_EAX,(tcg_target_long)local_108);
            ptVar31 = (tcg_insn_unit *)s->tb_ret_addr;
          }
          tcg_out_branch(s,0,ptVar31);
          break;
        case INDEX_op_goto_tb:
          if (s->tb_jmp_insn_offset == (uintptr_t *)0x0) {
            tcg_out_modrm_offset(s,0xff,4,-1,(intptr_t)(s->tb_jmp_target_addr + (long)local_108));
          }
          else {
            ptVar31 = s->code_ptr;
            iVar23 = (int)ptVar31;
            iVar42 = (iVar23 + 4U & 0xfffffffc) - iVar23;
            if (iVar42 != 1) {
              if (1 < iVar42 - 1U) {
                iVar23 = (iVar23 - (iVar23 + 4U & 0xfffffffc)) + 2;
                do {
                  ptVar31 = s->code_ptr;
                  s->code_ptr = ptVar31 + 1;
                  *ptVar31 = 'f';
                  iVar23 = iVar23 + 1;
                } while (iVar23 != 0);
                ptVar31 = s->code_ptr;
              }
              s->code_ptr = ptVar31 + 1;
              *ptVar31 = 0x90;
              ptVar31 = s->code_ptr;
            }
            s->code_ptr = ptVar31 + 1;
            *ptVar31 = 0xe9;
            ptVar31 = s->code_ptr;
            s->tb_jmp_insn_offset[(long)local_108] = (long)ptVar31 - (long)s->code_buf;
            ptVar31[0] = '\0';
            ptVar31[1] = '\0';
            ptVar31[2] = '\0';
            ptVar31[3] = '\0';
            s->code_ptr = ptVar31 + 4;
          }
          set_jmp_reset_offset(s,r);
          break;
        case INDEX_op_goto_ptr:
          ptVar31 = s->code_ptr;
          if (((ulong)local_108 & 8) != 0) {
            s->code_ptr = ptVar31 + 1;
            *ptVar31 = 'A';
            ptVar31 = s->code_ptr;
          }
          s->code_ptr = ptVar31 + 1;
          *ptVar31 = 0xff;
          pbVar30 = s->code_ptr;
          s->code_ptr = pbVar30 + 1;
          *pbVar30 = bVar64 & 7 | 0xe0;
          break;
        case INDEX_op_qemu_ld_i32:
          _Var19 = false;
          goto LAB_00a20a02;
        case INDEX_op_qemu_st_i32:
          _Var19 = false;
          goto LAB_00a20a16;
        case INDEX_op_qemu_ld_i64:
          _Var19 = true;
LAB_00a20a02:
          tcg_out_qemu_ld(s,(TCGArg *)&stack0xfffffffffffffef8,_Var19);
          break;
        case INDEX_op_qemu_st_i64:
          _Var19 = true;
LAB_00a20a16:
          tcg_out_qemu_st(s,(TCGArg *)&stack0xfffffffffffffef8,_Var19);
        }
        goto LAB_00a200e7;
      }
      if (0x2b < (TVar47 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64)) - INDEX_op_ld_vec) {
switchD_00a1f820_caseD_93:
        pcVar25 = 
        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
        ;
        iVar23 = 0xb75;
LAB_00a211a5:
        g_assertion_message_expr(pcVar25,iVar23,(char *)0x0);
      }
      uVar36 = TVar47 >> 0xc & 0xf;
      uVar58 = (ulong)uVar36;
      TVar49 = (TVar47 >> 8 & 0xf) + TCG_TYPE_V64;
      pTVar39 = local_f8;
      switch(TVar47 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64)) {
      case INDEX_op_ld_vec:
        tcg_out_ld(s,TVar49,r,base,(intptr_t)local_f8);
        goto LAB_00a200e7;
      case INDEX_op_st_vec:
        tcg_out_st(s,TVar49,r,base,(intptr_t)local_f8);
        goto LAB_00a200e7;
      case INDEX_op_dupm_vec:
        tcg_out_dupm_vec(s,TVar49,uVar36,r,base,(intptr_t)local_f8);
        goto LAB_00a200e7;
      case INDEX_op_add_vec:
        uVar36 = *(uint *)(tcg_out_vec_op_add_insn + uVar58 * 4);
        goto LAB_00a20099;
      case INDEX_op_sub_vec:
        puVar38 = tcg_out_vec_op_sub_insn;
        break;
      case INDEX_op_mul_vec:
        puVar38 = tcg_out_vec_op_mul_insn;
        break;
      default:
        goto switchD_00a1f820_caseD_93;
      case INDEX_op_abs_vec:
        uVar36 = *(uint *)(tcg_out_vec_op_abs_insn + uVar58 * 4);
        base = TCG_COND_NEVER;
        pTVar39 = local_100;
        goto LAB_00a20099;
      case INDEX_op_ssadd_vec:
        puVar38 = tcg_out_vec_op_ssadd_insn;
        break;
      case INDEX_op_usadd_vec:
        puVar38 = tcg_out_vec_op_usadd_insn;
        break;
      case INDEX_op_sssub_vec:
        puVar38 = tcg_out_vec_op_sssub_insn;
        break;
      case INDEX_op_ussub_vec:
        puVar38 = tcg_out_vec_op_ussub_insn;
        break;
      case INDEX_op_smin_vec:
        puVar38 = tcg_out_vec_op_smin_insn;
        break;
      case INDEX_op_umin_vec:
        puVar38 = tcg_out_vec_op_umin_insn;
        break;
      case INDEX_op_smax_vec:
        puVar38 = tcg_out_vec_op_smax_insn;
        break;
      case INDEX_op_umax_vec:
        puVar38 = tcg_out_vec_op_umax_insn;
        break;
      case INDEX_op_and_vec:
        uVar36 = 0x5db;
        goto LAB_00a20099;
      case INDEX_op_or_vec:
        uVar36 = 0x5eb;
        goto LAB_00a20099;
      case INDEX_op_xor_vec:
        uVar36 = 0x5ef;
        goto LAB_00a20099;
      case INDEX_op_andc_vec:
        tcg_out_vex_opc(s,(uint)(TVar49 == TCG_TYPE_V256) << 0x13 | 0x5df,r,TVar50,base,iVar23);
        pbVar30 = s->code_ptr;
        s->code_ptr = pbVar30 + 1;
        *pbVar30 = (bVar18 & 7) + bVar64 * '\b' | 0xc0;
        goto LAB_00a200e7;
      case INDEX_op_shli_vec:
        iVar42 = 6;
        goto LAB_00a1fc6c;
      case INDEX_op_shri_vec:
        iVar42 = 2;
        goto LAB_00a1fc6c;
      case INDEX_op_sari_vec:
        iVar42 = 4;
LAB_00a1fc6c:
        uVar36 = *(uint *)(tcg_out_vec_op_shift_imm_insn + uVar58 * 4) | 0x80000;
        if (TVar49 != TCG_TYPE_V256) {
          uVar36 = *(uint *)(tcg_out_vec_op_shift_imm_insn + uVar58 * 4);
        }
        tcg_out_vex_opc(s,uVar36,iVar42,r,base,iVar23);
        pbVar30 = s->code_ptr;
        s->code_ptr = pbVar30 + 1;
        *pbVar30 = (bVar18 & 7) + (char)iVar42 * '\b' | 0xc0;
        pbVar30 = s->code_ptr;
        s->code_ptr = pbVar30 + 1;
LAB_00a1fcc8:
        *pbVar30 = bVar35;
        goto LAB_00a200e7;
      case INDEX_op_shls_vec:
        puVar38 = tcg_out_vec_op_shls_insn;
        break;
      case INDEX_op_shrs_vec:
        puVar38 = tcg_out_vec_op_shrs_insn;
        break;
      case INDEX_op_sars_vec:
        puVar38 = tcg_out_vec_op_sars_insn;
        break;
      case INDEX_op_shlv_vec:
        puVar38 = tcg_out_vec_op_shlv_insn;
        break;
      case INDEX_op_shrv_vec:
        puVar38 = tcg_out_vec_op_shrv_insn;
        break;
      case INDEX_op_sarv_vec:
        puVar38 = tcg_out_vec_op_sarv_insn;
        break;
      case INDEX_op_cmp_vec:
        if (_local_f0 == TCG_COND_GT) {
          puVar38 = tcg_out_vec_op_cmpgt_insn;
        }
        else {
          if (_local_f0 != TCG_COND_EQ) {
            pcVar25 = 
            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
            ;
            iVar23 = 0xb20;
            goto LAB_00a211a5;
          }
          puVar38 = tcg_out_vec_op_cmpeq_insn;
        }
        break;
      case INDEX_op_x86_shufps_vec:
        uVar46 = 0x1c6;
        goto LAB_00a1fe2c;
      case INDEX_op_x86_vpblendvb_vec:
        tcg_out_vex_opc(s,(uint)(TVar49 == TCG_TYPE_V256) << 0x13 | 0x1044c,r,base,TVar50,iVar23);
        pbVar30 = s->code_ptr;
        s->code_ptr = pbVar30 + 1;
        *pbVar30 = (bVar35 & 7) + bVar64 * '\b' | 0xc0;
        ptVar31 = s->code_ptr;
        s->code_ptr = ptVar31 + 1;
        *ptVar31 = local_f0 << 4;
        goto LAB_00a200e7;
      case INDEX_op_x86_blend_vec:
        uVar46 = 0x1040e;
        if (uVar36 != 1) {
          if (uVar36 != 2) {
LAB_00a211bf:
            pcVar25 = 
            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
            ;
            iVar23 = 0xb53;
            goto LAB_00a211a5;
          }
          uVar46 = 0x1040c;
          if (have_avx2_sparc64 != false) {
            uVar46 = 0x10402;
          }
        }
        goto LAB_00a1fe2c;
      case INDEX_op_x86_packss_vec:
        puVar38 = tcg_out_vec_op_packss_insn;
        break;
      case INDEX_op_x86_packus_vec:
        puVar38 = tcg_out_vec_op_packus_insn;
        break;
      case INDEX_op_x86_psrldq_vec:
        tcg_out_vex_opc(s,0x573,3,r,base,iVar23);
        pbVar30 = s->code_ptr;
        s->code_ptr = pbVar30 + 1;
        *pbVar30 = bVar18 & 7 | 0xd8;
        pbVar30 = s->code_ptr;
        s->code_ptr = pbVar30 + 1;
        *pbVar30 = bVar35;
        goto LAB_00a200e7;
      case INDEX_op_x86_vperm2i128_vec:
        uVar46 = 0x90446;
LAB_00a1fe2c:
        tVar16 = local_f0;
        uVar36 = uVar46 | 0x80000;
        if (TVar49 != TCG_TYPE_V256) {
          uVar36 = uVar46;
        }
        tcg_out_vex_opc(s,uVar36,r,base,TVar50,iVar23);
        pbVar30 = s->code_ptr;
        s->code_ptr = pbVar30 + 1;
        *pbVar30 = (bVar35 & 7) + bVar64 * '\b' | 0xc0;
        ptVar31 = s->code_ptr;
        s->code_ptr = ptVar31 + 1;
        *ptVar31 = tVar16;
        goto LAB_00a200e7;
      case INDEX_op_x86_punpckl_vec:
        puVar38 = tcg_out_vec_op_punpckl_insn;
        break;
      case INDEX_op_x86_punpckh_vec:
        puVar38 = tcg_out_vec_op_punpckh_insn;
      }
      uVar36 = *(uint *)(puVar38 + uVar58 * 4);
LAB_00a20099:
      uVar46 = uVar36 | 0x80000;
      if (TVar49 != TCG_TYPE_V256) {
        uVar46 = uVar36;
      }
      tcg_out_vex_opc(s,uVar46,r,base,(int)pTVar39,iVar23);
      bVar18 = ((byte)pTVar39 & 7) + bVar64 * '\b';
LAB_00a200bd:
      pbVar30 = s->code_ptr;
      s->code_ptr = pbVar30 + 1;
      *pbVar30 = bVar18 | 0xc0;
LAB_00a200e7:
      if (uVar44 != 0) {
        uVar58 = 0;
        do {
          pTVar28 = *(TCGTemp **)(pTVar68 + uVar58 * 2 + 6);
          uVar36 = 4 << ((byte)uVar58 & 0x1f) & uVar45;
          if ((uVar45 >> ((uint)uVar58 & 0x1f) & 1) == 0) {
            if (uVar36 != 0) {
              uVar69 = *(ulong *)pTVar28;
              if (((uint)uVar69 & 0xff00) == 0x100) {
                ppTVar2[uVar69 & 0xff] = (TCGTemp *)0x0;
                uVar69 = *(ulong *)pTVar28;
              }
              uVar37 = uVar69 >> 0x1c & 0x200;
              if ((uVar69 & 0x4000000000) != 0) {
                uVar37 = 0x200;
              }
              *(ulong *)pTVar28 = uVar69 & 0xffffffffffff00ff | uVar37;
            }
          }
          else {
            temp_sync(s,pTVar28,TVar61,0,uVar36);
          }
          uVar58 = uVar58 + 1;
        } while (uVar44 != uVar58);
      }
LAB_00a1fb20:
      ptVar31 = s->code_ptr;
      if (s->code_gen_highwater < ptVar31) {
        return -1;
      }
      uVar58 = (long)ptVar31 - (long)s->code_buf;
      if (0xffff < uVar58) {
        return -2;
      }
      pTVar68 = *(TCGOpcode **)(pTVar68 + 2);
      in_R9 = uVar44;
    } while (pTVar68 != (TCGOpcode *)0x0);
  }
  s->gen_insn_end_off[local_134] = (uint16_t)uVar58;
  pTVar60 = (s->ldst_labels).sqh_first;
  do {
    if (pTVar60 == (TCGLabelQemuLdst *)0x0) {
      iVar23 = tcg_out_pool_finalize(s);
      if (-1 < iVar23) {
        for (pTVar39 = (s->labels).sqh_first; pTVar39 != (TCGLabel *)0x0;
            pTVar39 = (pTVar39->next).sqe_next) {
          value = (pTVar39->u).value;
          pTVar70 = (TCGRelocation *)&pTVar39->relocs;
          while (pTVar70 = (pTVar70->next).sqe_next, pTVar70 != (TCGRelocation *)0x0) {
            _Var19 = patch_reloc(pTVar70->ptr,pTVar70->type,value,pTVar70->addend);
            if (!_Var19) {
              return -2;
            }
          }
        }
        iVar23 = *(int *)&s->code_ptr - *(int *)&s->code_buf;
      }
      return iVar23;
    }
    uVar45 = pTVar60->oi;
    uVar36 = uVar45 >> 4;
    if (pTVar60->is_ld != true) {
      *(int *)pTVar60->label_ptr[0] = ((int)ptVar31 - (int)pTVar60->label_ptr[0]) + -4;
      ptVar31 = s->code_ptr;
      s->code_ptr = ptVar31 + 1;
      *ptVar31 = 'H';
      ptVar31 = s->code_ptr;
      s->code_ptr = ptVar31 + 1;
      *ptVar31 = 0x8b;
      ptVar31 = s->code_ptr;
      s->code_ptr = ptVar31 + 1;
      *ptVar31 = 0xfd;
      tcg_out_mov(s,(uint)((~uVar45 & 0x30) == 0),TCG_REG_EDX,pTVar60->datalo_reg);
      tcg_out_movi(s,TCG_TYPE_I32,TCG_REG_ECX,(ulong)uVar45);
      tcg_out_movi(s,TCG_TYPE_I64,TCG_REG_R8,(tcg_target_long)pTVar60->raddr);
      ptVar31 = s->code_ptr;
      s->code_ptr = ptVar31 + 1;
      *ptVar31 = 'A';
      ptVar31 = s->code_ptr;
      s->code_ptr = ptVar31 + 1;
      *ptVar31 = 'P';
      pptVar63 = (tcg_insn_unit **)(qemu_st_helpers + (uVar36 & 0xb));
      goto LAB_00a210a6;
    }
    uVar46 = (uint)(pTVar60->type == TCG_TYPE_I64) << 0xc;
    *(int *)pTVar60->label_ptr[0] = ((int)ptVar31 - (int)pTVar60->label_ptr[0]) + -4;
    ptVar31 = s->code_ptr;
    s->code_ptr = ptVar31 + 1;
    *ptVar31 = 'H';
    ptVar31 = s->code_ptr;
    s->code_ptr = ptVar31 + 1;
    *ptVar31 = 0x8b;
    ptVar31 = s->code_ptr;
    s->code_ptr = ptVar31 + 1;
    *ptVar31 = 0xfd;
    tcg_out_movi(s,TCG_TYPE_I32,TCG_REG_EDX,(ulong)uVar45);
    pptVar63 = &pTVar60->raddr;
    tcg_out_movi(s,TCG_TYPE_I64,TCG_REG_ECX,(tcg_target_long)pTVar60->raddr);
    tcg_out_branch(s,1,(tcg_insn_unit *)qemu_ld_helpers[uVar36 & 0xb]);
    TVar21 = pTVar60->datalo_reg;
    switch(uVar36 & 7) {
    default:
      TVar49 = TCG_TYPE_I32;
      break;
    case 3:
      TVar49 = TCG_TYPE_I64;
      break;
    case 4:
      uVar46 = uVar46 | 0x41be;
      goto LAB_00a21077;
    case 5:
      uVar46 = uVar46 | 0x1bf;
LAB_00a21077:
      tcg_out_opc(s,uVar46,TVar21,0,0);
LAB_00a21089:
      pbVar30 = s->code_ptr;
      s->code_ptr = pbVar30 + 1;
      *pbVar30 = (byte)TVar21 << 3 | 0xc0;
      goto LAB_00a210a6;
    case 6:
      pbVar30 = s->code_ptr;
      s->code_ptr = pbVar30 + 1;
      *pbVar30 = (byte)TVar21 >> 1 & 4 | 0x48;
      ptVar31 = s->code_ptr;
      s->code_ptr = ptVar31 + 1;
      *ptVar31 = 'c';
      goto LAB_00a21089;
    case 7:
      tcg_gen_code_sparc64_cold_4();
LAB_00a21175:
      tcg_gen_code_sparc64_cold_1();
LAB_00a2117a:
      __assert_fail("s->gen_insn_end_off[num_insns] == off",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
                    ,0xedf,"int tcg_gen_code_sparc64(TCGContext *, TranslationBlock *)");
    }
    tcg_out_mov(s,TVar49,TVar21,TCG_REG_EAX);
LAB_00a210a6:
    tcg_out_branch(s,0,*pptVar63);
    ptVar31 = s->code_ptr;
    if (s->code_gen_highwater < ptVar31) {
      return -1;
    }
    pTVar60 = (pTVar60->next).sqe_next;
  } while( true );
}

Assistant:

int tcg_gen_code(TCGContext *s, TranslationBlock *tb)
{
    int i, num_insns;
    TCGOp *op;

#ifndef NDEBUG
    if (getenv("UNICORN_DEBUG")) {
        tcg_dump_ops(s, false, "TCG before optimization:");
    }
#endif

#ifdef CONFIG_DEBUG_TCG
    /* Ensure all labels referenced have been emitted.  */
    {
        TCGLabel *l;
        bool error = false;

        QSIMPLEQ_FOREACH(l, &s->labels, next) {
            if (unlikely(!l->present) && l->refs) {
                error = true;
            }
        }
        assert(!error);
    }
#endif

#ifdef USE_TCG_OPTIMIZATIONS
    tcg_optimize(s);
#endif
    //tcg_dump_ops(s, false, "after opt1:");
    reachable_code_pass(s);
    //tcg_dump_ops(s, false, "after opt2:");
    liveness_pass_1(s);
    //tcg_dump_ops(s, false, "after opt3:");
    if (s->nb_indirects > 0) {
        /* Replace indirect temps with direct temps.  */
        if (liveness_pass_2(s)) {
            /* If changes were made, re-run liveness.  */
            liveness_pass_1(s);
        }
    }
    //tcg_dump_ops(s, false, "after opt4:");
    tcg_reg_alloc_start(s);

    s->code_buf = tb->tc.ptr;
    s->code_ptr = tb->tc.ptr;

#ifdef TCG_TARGET_NEED_LDST_LABELS
    QSIMPLEQ_INIT(&s->ldst_labels);
#endif
#ifdef TCG_TARGET_NEED_POOL_LABELS
    s->pool_labels = NULL;
#endif

#ifndef NDEBUG
    if (getenv("UNICORN_DEBUG")) {
        tcg_dump_ops(s, false, "TCG before codegen:");
    }
#endif
    num_insns = -1;
    QTAILQ_FOREACH(op, &s->ops, link) {
        TCGOpcode opc = op->opc;

        switch (opc) {
        case INDEX_op_mov_i32:
        case INDEX_op_mov_i64:
        case INDEX_op_mov_vec:
            tcg_reg_alloc_mov(s, op);
            break;
        case INDEX_op_movi_i32:
        case INDEX_op_movi_i64:
        case INDEX_op_dupi_vec:
            tcg_reg_alloc_movi(s, op);
            break;
        case INDEX_op_dup_vec:
            tcg_reg_alloc_dup(s, op);
            break;
        case INDEX_op_insn_start:
            if (num_insns >= 0) {
                size_t off = tcg_current_code_size(s);
                s->gen_insn_end_off[num_insns] = off;
                /* Assert that we do not overflow our stored offset.  */
                assert(s->gen_insn_end_off[num_insns] == off);
            }
            num_insns++;
            for (i = 0; i < TARGET_INSN_START_WORDS; ++i) {
                target_ulong a;
#if TARGET_LONG_BITS > TCG_TARGET_REG_BITS
                a = deposit64(op->args[i * 2], 32, 32, op->args[i * 2 + 1]);
#else
                a = op->args[i];
#endif
                s->gen_insn_data[num_insns][i] = a;
            }
            break;
        case INDEX_op_discard:
            temp_dead(s, arg_temp(op->args[0]));
            break;
        case INDEX_op_set_label:
            tcg_reg_alloc_bb_end(s, s->reserved_regs);
            tcg_out_label(s, arg_label(op->args[0]), s->code_ptr);
            break;
        case INDEX_op_call:
            tcg_reg_alloc_call(s, op);
            break;
        default:
            /* Sanity check that we've not introduced any unhandled opcodes. */
            tcg_debug_assert(tcg_op_supported(opc));
            /* Note: in order to speed up the code, it would be much
               faster to have specialized register allocator functions for
               some common argument patterns */
            tcg_reg_alloc_op(s, op);
            break;
        }
#ifdef CONFIG_DEBUG_TCG
        check_regs(s);
#endif

        /* Test for (pending) buffer overflow.  The assumption is that any
           one operation beginning below the high water mark cannot overrun
           the buffer completely.  Thus we can test for overflow after
           generating code without having to check during generation.  */
        if (unlikely((void *)s->code_ptr > s->code_gen_highwater)) {
            return -1;
        }
        /* Test for TB overflow, as seen by gen_insn_end_off.  */
        if (unlikely(tcg_current_code_size(s) > UINT16_MAX)) {
            return -2;
        }
    }
    tcg_debug_assert(num_insns >= 0);
    s->gen_insn_end_off[num_insns] = tcg_current_code_size(s);

    /* Generate TB finalization at the end of block */
#ifdef TCG_TARGET_NEED_LDST_LABELS
    i = tcg_out_ldst_finalize(s);
    if (i < 0) {
        return i;
    }
#endif
#ifdef TCG_TARGET_NEED_POOL_LABELS
    i = tcg_out_pool_finalize(s);
    if (i < 0) {
        return i;
    }
#endif
    if (!tcg_resolve_relocs(s)) {
        return -2;
    }

    /* flush instruction cache */
    flush_icache_range((uintptr_t)s->code_buf, (uintptr_t)s->code_ptr);

    return tcg_current_code_size(s);
}